

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O2

size_t KeccakF1600_FastLoop_Absorb(void *state,uint laneCount,uchar *data,size_t dataByteLen)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  
  local_148 = *(ulong *)((long)state + 0x28);
  local_e8 = *(ulong *)((long)state + 0x30);
  local_f8 = *(ulong *)((long)state + 0x90);
  auVar42 = *state;
  auVar43[8] = 0xff;
  auVar43._0_8_ = 0xffffffffffffffff;
  auVar43[9] = 0xff;
  auVar43[10] = 0xff;
  auVar43[0xb] = 0xff;
  auVar43[0xc] = 0xff;
  auVar43[0xd] = 0xff;
  auVar43[0xe] = 0xff;
  auVar43[0xf] = 0xff;
  auVar43[0x10] = 0xff;
  auVar43[0x11] = 0xff;
  auVar43[0x12] = 0xff;
  auVar43[0x13] = 0xff;
  auVar43[0x14] = 0xff;
  auVar43[0x15] = 0xff;
  auVar43[0x16] = 0xff;
  auVar43[0x17] = 0xff;
  auVar43[0x18] = 0xff;
  auVar43[0x19] = 0xff;
  auVar43[0x1a] = 0xff;
  auVar43[0x1b] = 0xff;
  auVar43[0x1c] = 0xff;
  auVar43[0x1d] = 0xff;
  auVar43[0x1e] = 0xff;
  auVar43[0x1f] = 0xff;
  auVar44._8_8_ = 0x8000000080008008;
  auVar44._0_8_ = 0x8000000080008008;
  local_100 = *(ulong *)((long)state + 0x20);
  uVar29 = *(ulong *)((long)state + 0x58);
  uVar22 = *(ulong *)((long)state + 0x70);
  uVar17 = *(ulong *)((long)state + 0x78);
  uVar10 = *(ulong *)((long)state + 0xa0);
  local_128 = *(ulong *)((long)state + 0xb8);
  local_d8 = *(ulong *)((long)state + 0x38);
  local_f0 = *(ulong *)((long)state + 0x40);
  local_108 = *(ulong *)((long)state + 0xb0);
  local_e0 = *(ulong *)((long)state + 0x48);
  local_150 = *(ulong *)((long)state + 0x50);
  local_130 = *(ulong *)((long)state + 0xc0);
  local_160 = *(ulong *)((long)state + 0x60);
  local_138 = *(ulong *)((long)state + 0x68);
  local_120 = *(ulong *)((long)state + 0x80);
  local_158 = *(ulong *)((long)state + 0x98);
  uVar19 = *(ulong *)((long)state + 0x88);
  local_110 = *(ulong *)((long)state + 0xa8);
  for (lVar4 = 0; (ulong)(laneCount * 8) <= dataByteLen + lVar4;
      lVar4 = lVar4 - (ulong)(laneCount * 8)) {
    if (laneCount == 0x15) {
      uVar29 = uVar29 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x18);
      local_100 = local_100 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x20);
      auVar42 = auVar42 ^ *(undefined1 (*) [32])data;
      local_148 = local_148 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 8);
      local_138 = local_138 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 8);
      uVar17 = uVar17 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 0x18);
      uVar19 = uVar19 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 8);
      local_d8 = local_d8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x18);
      local_f0 = local_f0 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x40);
      local_e8 = local_e8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x10);
      local_e0 = local_e0 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 8);
      local_150 = local_150 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x10);
      local_120 = local_120 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x80);
      uVar10 = uVar10 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0xa0);
      uVar22 = uVar22 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 0x10);
      local_f8 = local_f8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x10);
      local_160 = local_160 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x60);
      local_158 = local_158 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x18);
    }
    else if (laneCount < 0x10) {
      if (laneCount < 8) {
        if (laneCount < 4) {
          if (laneCount < 2) {
            if (laneCount != 0) {
              auVar42 = vpblendd_avx2(auVar42,ZEXT832(auVar42._0_8_ ^
                                                      *(ulong *)*(undefined1 (*) [32])data),3);
            }
          }
          else {
            auVar42 = vpblendd_avx2(auVar42,ZEXT1632(auVar42._0_16_ ^
                                                     *(undefined1 (*) [16])
                                                      *(undefined1 (*) [32])data),0xf);
            if (laneCount == 3) {
              auVar41 = vpbroadcastq_avx512vl();
              auVar42 = vpblendd_avx2(auVar42,auVar41,0x30);
            }
          }
        }
        else {
          auVar42 = auVar42 ^ *(undefined1 (*) [32])data;
          if (laneCount < 6) {
            if (laneCount != 4) {
              local_100 = local_100 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x20);
            }
          }
          else {
            local_100 = local_100 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x20);
            local_148 = local_148 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 8);
            if (laneCount == 7) {
              local_e8 = local_e8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x10);
            }
          }
        }
      }
      else {
        auVar42 = auVar42 ^ *(undefined1 (*) [32])data;
        local_100 = local_100 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x20);
        local_d8 = local_d8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x18);
        local_e8 = local_e8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x10);
        local_148 = local_148 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 8);
        if (laneCount < 0xc) {
          if (laneCount < 10) {
            if (laneCount != 8) {
              local_f0 = local_f0 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x40);
            }
          }
          else {
            local_e0 = local_e0 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 8);
            local_f0 = local_f0 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x40);
            if (laneCount == 0xb) {
              local_150 = local_150 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x10);
            }
          }
        }
        else {
          local_150 = local_150 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x10);
          local_e0 = local_e0 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 8);
          local_f0 = local_f0 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x40);
          uVar29 = uVar29 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x18);
          if (laneCount < 0xe) {
            if (laneCount != 0xc) {
              local_160 = local_160 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x60);
            }
          }
          else {
            local_160 = local_160 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x60);
            local_138 = local_138 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 8);
            if (laneCount == 0xf) {
              uVar22 = uVar22 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 0x10);
            }
          }
        }
      }
    }
    else {
      local_100 = local_100 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x20);
      local_d8 = local_d8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x18);
      uVar29 = uVar29 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x18);
      local_150 = local_150 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 0x10);
      auVar42 = auVar42 ^ *(undefined1 (*) [32])data;
      local_e8 = local_e8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 0x10);
      local_e0 = local_e0 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x40) + 8);
      uVar17 = uVar17 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 0x18);
      local_f0 = local_f0 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x40);
      local_148 = local_148 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x20) + 8);
      local_160 = local_160 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x60);
      local_138 = local_138 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 8);
      uVar22 = uVar22 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x60) + 0x10);
      if (laneCount < 0x18) {
        if (laneCount < 0x14) {
          if (laneCount < 0x12) {
            if (laneCount != 0x10) {
              local_120 = local_120 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x80);
            }
          }
          else {
            local_120 = local_120 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x80);
            uVar19 = uVar19 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 8);
            if (laneCount == 0x13) {
              local_f8 = local_f8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x10);
            }
          }
        }
        else {
          local_120 = local_120 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x80);
          uVar19 = uVar19 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 8);
          local_f8 = local_f8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x10);
          local_158 = local_158 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x18);
          if (0x15 < laneCount) {
            uVar10 = uVar10 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0xa0);
            local_110 = local_110 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0xa0) + 8);
            if (laneCount == 0x17) {
              local_108 = local_108 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0xa0) + 0x10);
            }
          }
        }
      }
      else {
        local_120 = local_120 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0x80);
        uVar19 = uVar19 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 8);
        uVar10 = uVar10 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0xa0);
        local_110 = local_110 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0xa0) + 8);
        local_f8 = local_f8 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x10);
        local_158 = local_158 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0x80) + 0x18);
        local_108 = local_108 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0xa0) + 0x10);
        local_128 = local_128 ^ *(ulong *)(*(undefined1 (*) [32])((long)data + 0xa0) + 0x18);
        if (laneCount != 0x18) {
          local_130 = local_130 ^ *(ulong *)*(undefined1 (*) [32])((long)data + 0xc0);
        }
      }
    }
    uVar20 = uVar22 ^ local_e0 ^ local_158 ^ local_130 ^ local_100;
    uVar1 = vpextrq_avx(auVar42._0_16_,1);
    uVar18 = local_150 ^ local_148 ^ uVar17 ^ uVar10 ^ auVar42._0_8_;
    uVar14 = uVar29 ^ local_e8 ^ local_120 ^ local_110 ^ uVar1;
    uVar23 = vpextrq_avx(auVar42._16_16_,1);
    uVar11 = local_160 ^ local_d8 ^ uVar19 ^ local_108 ^ auVar42._16_8_;
    uVar33 = local_138 ^ local_f0 ^ local_f8 ^ local_128 ^ uVar23;
    uVar2 = (uVar33 >> 0x3f | uVar33 << 1) ^ uVar14;
    uVar13 = (uVar14 >> 0x3f | uVar14 << 1) ^ uVar20;
    uVar21 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar11;
    uVar30 = (local_160 ^ uVar2) >> 0x15 | (local_160 ^ uVar2) << 0x2b;
    uVar3 = auVar42._0_8_ ^ uVar13;
    uVar12 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar18;
    uVar33 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar33;
    uVar15 = (local_e8 ^ uVar12) >> 0x14 | (local_e8 ^ uVar12) << 0x2c;
    uVar11 = (local_f8 ^ uVar21) >> 0x2b | (local_f8 ^ uVar21) << 0x15;
    uVar34 = (local_130 ^ uVar33) >> 0x32 | (local_130 ^ uVar33) << 0xe;
    uVar5 = ~uVar11 & uVar34 ^ uVar30;
    uVar20 = ~uVar34 & uVar3 ^ uVar11;
    uVar11 = ~uVar30 & uVar11 ^ uVar15;
    uVar16 = (local_150 ^ uVar13) >> 0x3d | (local_150 ^ uVar13) << 3;
    uVar14 = (uVar23 ^ uVar21) >> 0x24 | (uVar23 ^ uVar21) << 0x1c;
    uVar34 = ~uVar3 & uVar15 ^ uVar34;
    uVar23 = (local_e0 ^ uVar33) >> 0x2c | (local_e0 ^ uVar33) << 0x14;
    uVar31 = (local_120 ^ uVar12) >> 0x13 | (local_120 ^ uVar12) << 0x2d;
    uVar24 = ~uVar16 & uVar31 ^ uVar23;
    uVar18 = (local_108 ^ uVar2) >> 3 | (local_108 ^ uVar2) << 0x3d;
    uVar6 = ~uVar18 & uVar14 ^ uVar31;
    uVar35 = (uVar19 ^ uVar2) >> 0x31 | (uVar19 ^ uVar2) << 0xf;
    uVar31 = ~uVar31 & uVar18 ^ uVar16;
    uVar7 = ~uVar23 & uVar16 ^ uVar14;
    uVar18 = ~uVar14 & uVar23 ^ uVar18;
    uVar19 = uVar2 ^ auVar42._16_8_;
    uVar2 = (local_d8 ^ uVar2) >> 0x3a | (local_d8 ^ uVar2) << 6;
    uVar38 = uVar19 >> 2 | uVar19 << 0x3e;
    uVar14 = (local_138 ^ uVar21) >> 0x27 | (local_138 ^ uVar21) << 0x19;
    uVar19 = (uVar1 ^ uVar12) >> 0x3f | (uVar1 ^ uVar12) << 1;
    uVar1 = (local_158 ^ uVar33) >> 0x38 | (local_158 ^ uVar33) << 8;
    uVar10 = (uVar10 ^ uVar13) >> 0x2e | (uVar10 ^ uVar13) << 0x12;
    uVar8 = ~uVar10 & uVar19 ^ uVar1;
    uVar36 = ~uVar1 & uVar10 ^ uVar14;
    uVar16 = ~uVar2 & uVar14 ^ uVar19;
    uVar9 = ~uVar14 & uVar1 ^ uVar2;
    uVar10 = ~uVar19 & uVar2 ^ uVar10;
    uVar19 = (local_148 ^ uVar13) >> 0x1c | (local_148 ^ uVar13) << 0x24;
    uVar32 = (uVar29 ^ uVar12) >> 0x36 | (uVar29 ^ uVar12) << 10;
    uVar1 = (local_100 ^ uVar33) >> 0x25 | (local_100 ^ uVar33) << 0x1b;
    uVar2 = ~uVar32 & uVar35 ^ uVar19;
    uVar25 = ~uVar19 & uVar32 ^ uVar1;
    uVar14 = (uVar33 ^ uVar22) >> 0x19 | (uVar33 ^ uVar22) << 0x27;
    uVar29 = (local_128 ^ uVar21) >> 8 | (local_128 ^ uVar21) << 0x38;
    uVar23 = ~uVar1 & uVar19 ^ uVar29;
    uVar27 = ~uVar29 & uVar1 ^ uVar35;
    uVar32 = ~uVar35 & uVar29 ^ uVar32;
    uVar19 = (uVar21 ^ local_f0) >> 9 | (uVar21 ^ local_f0) << 0x37;
    uVar17 = (uVar13 ^ uVar17) >> 0x17 | (uVar13 ^ uVar17) << 0x29;
    uVar29 = ~uVar19 & uVar14 ^ uVar38;
    uVar40 = ~uVar15 & uVar30 ^ uVar3 ^ 1;
    uVar1 = uVar7 ^ uVar29 ^ uVar16 ^ uVar25 ^ uVar40;
    uVar22 = (uVar12 ^ local_110) >> 0x3e | (uVar12 ^ local_110) << 2;
    uVar12 = ~uVar17 & uVar22 ^ uVar14;
    uVar15 = ~uVar22 & uVar38 ^ uVar17;
    uVar35 = ~uVar14 & uVar17 ^ uVar19;
    uVar17 = uVar12 ^ uVar5 ^ uVar31 ^ uVar32 ^ uVar36;
    uVar22 = ~uVar38 & uVar19 ^ uVar22;
    uVar3 = uVar2 ^ uVar9 ^ uVar24 ^ uVar11 ^ uVar35;
    uVar14 = uVar10 ^ uVar18 ^ uVar34 ^ uVar22 ^ uVar23;
    uVar21 = uVar15 ^ uVar20 ^ uVar8 ^ uVar6 ^ uVar27;
    uVar39 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar3;
    uVar21 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar21;
    uVar36 = uVar36 ^ uVar39;
    uVar12 = uVar12 ^ uVar39;
    uVar22 = uVar22 ^ uVar21;
    uVar18 = uVar18 ^ uVar21;
    uVar19 = uVar12 >> 3 | uVar12 << 0x3d;
    uVar3 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar14;
    uVar22 = uVar22 >> 0x32 | uVar22 << 0xe;
    uVar40 = uVar40 ^ uVar3;
    uVar38 = (uVar14 >> 0x3f | uVar14 << 1) ^ uVar17;
    uVar1 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar1;
    uVar33 = uVar36 >> 0x15 | uVar36 << 0x2b;
    uVar27 = uVar27 ^ uVar38;
    uVar17 = uVar27 >> 0x2b | uVar27 << 0x15;
    uVar14 = ~uVar22 & uVar40 ^ uVar17;
    uVar24 = uVar24 ^ uVar1;
    uVar13 = ~uVar17 & uVar22 ^ uVar33;
    uVar30 = uVar18 >> 0x2c | uVar18 << 0x14;
    uVar24 = uVar24 >> 0x14 | uVar24 << 0x2c;
    uVar18 = ~uVar33 & uVar17 ^ uVar24;
    uVar22 = ~uVar40 & uVar24 ^ uVar22;
    uVar20 = uVar20 ^ uVar38;
    uVar2 = uVar2 ^ uVar1;
    uVar16 = uVar16 ^ uVar3;
    uVar17 = uVar20 >> 0x24 | uVar20 << 0x1c;
    uVar2 = uVar2 >> 0x13 | uVar2 << 0x2d;
    uVar20 = uVar16 >> 0x3d | uVar16 << 3;
    uVar27 = ~uVar19 & uVar17 ^ uVar2;
    uVar16 = ~uVar2 & uVar19 ^ uVar20;
    uVar2 = ~uVar20 & uVar2 ^ uVar30;
    uVar12 = ~uVar30 & uVar20 ^ uVar17;
    uVar19 = ~uVar17 & uVar30 ^ uVar19;
    uVar11 = uVar11 ^ uVar1;
    uVar29 = uVar29 ^ uVar3;
    uVar17 = uVar11 >> 0x3f | uVar11 << 1;
    uVar29 = uVar29 >> 0x2e | uVar29 << 0x12;
    uVar8 = uVar8 ^ uVar38;
    uVar23 = uVar23 ^ uVar21;
    uVar31 = uVar31 ^ uVar39;
    uVar30 = uVar8 >> 0x27 | uVar8 << 0x19;
    uVar23 = uVar23 >> 0x38 | uVar23 << 8;
    uVar11 = uVar31 >> 0x3a | uVar31 << 6;
    uVar8 = ~uVar29 & uVar17 ^ uVar23;
    uVar15 = uVar15 ^ uVar38;
    uVar38 = uVar38 ^ uVar6;
    uVar20 = ~uVar23 & uVar29 ^ uVar30;
    uVar6 = ~uVar11 & uVar30 ^ uVar17;
    uVar23 = ~uVar30 & uVar23 ^ uVar11;
    uVar29 = ~uVar17 & uVar11 ^ uVar29;
    uVar32 = uVar32 ^ uVar39;
    uVar39 = uVar39 ^ uVar5;
    uVar7 = uVar7 ^ uVar3;
    uVar30 = uVar32 >> 0x31 | uVar32 << 0xf;
    uVar17 = uVar7 >> 0x1c | uVar7 << 0x24;
    uVar15 = uVar15 >> 8 | uVar15 << 0x38;
    uVar9 = uVar9 ^ uVar1;
    uVar11 = uVar9 >> 0x36 | uVar9 << 10;
    uVar31 = ~uVar30 & uVar15 ^ uVar11;
    uVar7 = ~uVar11 & uVar30 ^ uVar17;
    uVar34 = uVar34 ^ uVar21;
    uVar21 = uVar21 ^ uVar10;
    uVar10 = uVar34 >> 0x25 | uVar34 << 0x1b;
    uVar3 = uVar3 ^ uVar25;
    uVar9 = uVar39 >> 2 | uVar39 << 0x3e;
    uVar32 = ~uVar17 & uVar11 ^ uVar10;
    uVar30 = ~uVar15 & uVar10 ^ uVar30;
    uVar15 = ~uVar10 & uVar17 ^ uVar15;
    uVar1 = uVar1 ^ uVar35;
    uVar36 = ~uVar24 & uVar33 ^ uVar40 ^ 0x8082;
    uVar1 = uVar1 >> 0x3e | uVar1 << 2;
    uVar11 = uVar38 >> 9 | uVar38 << 0x37;
    uVar24 = uVar21 >> 0x19 | uVar21 << 0x27;
    uVar34 = ~uVar11 & uVar24 ^ uVar9;
    uVar35 = uVar32 ^ uVar34 ^ uVar12 ^ uVar6 ^ uVar36;
    uVar10 = uVar3 >> 0x17 | uVar3 << 0x29;
    uVar17 = ~uVar1 & uVar9 ^ uVar10;
    uVar3 = ~uVar24 & uVar10 ^ uVar11;
    uVar5 = uVar8 ^ uVar30 ^ uVar14 ^ uVar27 ^ uVar17;
    uVar24 = ~uVar10 & uVar1 ^ uVar24;
    uVar1 = ~uVar9 & uVar11 ^ uVar1;
    uVar10 = uVar23 ^ uVar7 ^ uVar18 ^ uVar2 ^ uVar3;
    uVar9 = uVar29 ^ uVar15 ^ uVar22 ^ uVar19 ^ uVar1;
    uVar21 = uVar20 ^ uVar31 ^ uVar13 ^ uVar16 ^ uVar24;
    uVar38 = (uVar35 >> 0x3f | uVar35 << 1) ^ uVar5;
    uVar33 = (uVar5 >> 0x3f | uVar5 << 1) ^ uVar10;
    uVar1 = uVar1 ^ uVar38;
    uVar39 = (uVar9 >> 0x3f | uVar9 << 1) ^ uVar21;
    uVar11 = uVar1 >> 0x32 | uVar1 << 0xe;
    uVar9 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar9;
    uVar30 = uVar30 ^ uVar39;
    uVar24 = uVar24 ^ uVar33;
    uVar35 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar35;
    uVar36 = uVar36 ^ uVar9;
    uVar1 = uVar24 >> 3 | uVar24 << 0x3d;
    uVar2 = uVar2 ^ uVar35;
    uVar10 = uVar2 >> 0x14 | uVar2 << 0x2c;
    uVar20 = uVar20 ^ uVar33;
    uVar25 = uVar20 >> 0x15 | uVar20 << 0x2b;
    uVar5 = uVar36 ^ 0x800000000000808a ^ ~uVar10 & uVar25;
    uVar24 = uVar30 >> 0x2b | uVar30 << 0x15;
    uVar20 = ~uVar25 & uVar24 ^ uVar10;
    uVar25 = ~uVar24 & uVar11 ^ uVar25;
    uVar10 = ~uVar36 & uVar10 ^ uVar11;
    uVar24 = ~uVar11 & uVar36 ^ uVar24;
    uVar6 = uVar6 ^ uVar9;
    uVar19 = uVar19 ^ uVar38;
    uVar6 = uVar6 >> 0x3d | uVar6 << 3;
    uVar14 = uVar14 ^ uVar39;
    uVar2 = uVar19 >> 0x2c | uVar19 << 0x14;
    uVar19 = uVar14 >> 0x24 | uVar14 << 0x1c;
    uVar7 = uVar7 ^ uVar35;
    uVar11 = uVar7 >> 0x13 | uVar7 << 0x2d;
    uVar30 = ~uVar1 & uVar19 ^ uVar11;
    uVar7 = ~uVar11 & uVar1 ^ uVar6;
    uVar11 = ~uVar6 & uVar11 ^ uVar2;
    uVar21 = ~uVar2 & uVar6 ^ uVar19;
    uVar1 = ~uVar19 & uVar2 ^ uVar1;
    uVar8 = uVar8 ^ uVar39;
    uVar16 = uVar16 ^ uVar33;
    uVar6 = uVar8 >> 0x27 | uVar8 << 0x19;
    uVar14 = uVar16 >> 0x3a | uVar16 << 6;
    uVar18 = uVar18 ^ uVar35;
    uVar19 = uVar18 >> 0x3f | uVar18 << 1;
    uVar15 = uVar15 ^ uVar38;
    uVar8 = uVar15 >> 0x38 | uVar15 << 8;
    uVar15 = ~uVar6 & uVar8 ^ uVar14;
    uVar34 = uVar34 ^ uVar9;
    uVar2 = uVar34 >> 0x2e | uVar34 << 0x12;
    uVar34 = ~uVar8 & uVar2 ^ uVar6;
    uVar8 = ~uVar2 & uVar19 ^ uVar8;
    uVar6 = ~uVar14 & uVar6 ^ uVar19;
    uVar2 = ~uVar19 & uVar14 ^ uVar2;
    uVar22 = uVar22 ^ uVar38;
    uVar38 = uVar38 ^ uVar29;
    uVar22 = uVar22 >> 0x25 | uVar22 << 0x1b;
    uVar12 = uVar12 ^ uVar9;
    uVar19 = uVar12 >> 0x1c | uVar12 << 0x24;
    uVar23 = uVar23 ^ uVar35;
    uVar29 = uVar23 >> 0x36 | uVar23 << 10;
    uVar18 = ~uVar19 & uVar29 ^ uVar22;
    uVar31 = uVar31 ^ uVar33;
    uVar14 = uVar31 >> 0x31 | uVar31 << 0xf;
    uVar23 = ~uVar29 & uVar14 ^ uVar19;
    uVar17 = uVar17 ^ uVar39;
    uVar39 = uVar39 ^ uVar27;
    uVar16 = uVar17 >> 8 | uVar17 << 0x38;
    uVar29 = ~uVar14 & uVar16 ^ uVar29;
    uVar14 = ~uVar16 & uVar22 ^ uVar14;
    uVar16 = ~uVar22 & uVar19 ^ uVar16;
    uVar33 = uVar33 ^ uVar13;
    uVar35 = uVar35 ^ uVar3;
    uVar9 = uVar9 ^ uVar32;
    uVar19 = uVar33 >> 2 | uVar33 << 0x3e;
    uVar22 = uVar39 >> 9 | uVar39 << 0x37;
    uVar31 = uVar38 >> 0x19 | uVar38 << 0x27;
    uVar3 = uVar35 >> 0x3e | uVar35 << 2;
    uVar36 = ~uVar22 & uVar31 ^ uVar19;
    uVar27 = uVar6 ^ uVar18 ^ uVar5 ^ uVar21 ^ uVar36;
    uVar17 = uVar9 >> 0x17 | uVar9 << 0x29;
    uVar35 = ~uVar3 & uVar19 ^ uVar17;
    uVar13 = ~uVar31 & uVar17 ^ uVar22;
    uVar19 = ~uVar19 & uVar22 ^ uVar3;
    uVar31 = ~uVar17 & uVar3 ^ uVar31;
    uVar3 = uVar8 ^ uVar14 ^ uVar24 ^ uVar30 ^ uVar35;
    uVar9 = uVar15 ^ uVar23 ^ uVar20 ^ uVar11 ^ uVar13;
    uVar17 = uVar2 ^ uVar16 ^ uVar10 ^ uVar1 ^ uVar19;
    uVar12 = uVar34 ^ uVar29 ^ uVar25 ^ uVar7 ^ uVar31;
    uVar22 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar9;
    uVar33 = (uVar9 >> 0x3f | uVar9 << 1) ^ uVar17;
    uVar37 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar12;
    uVar31 = uVar31 ^ uVar22;
    uVar12 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar27;
    uVar14 = uVar14 ^ uVar37;
    uVar36 = uVar36 ^ uVar33;
    uVar3 = (uVar27 >> 0x3f | uVar27 << 1) ^ uVar3;
    uVar5 = uVar5 ^ uVar33;
    uVar19 = uVar19 ^ uVar3;
    uVar19 = uVar19 >> 0x32 | uVar19 << 0xe;
    uVar11 = uVar11 ^ uVar12;
    uVar17 = uVar11 >> 0x14 | uVar11 << 0x2c;
    uVar34 = uVar34 ^ uVar22;
    uVar11 = uVar34 >> 0x15 | uVar34 << 0x2b;
    uVar39 = uVar5 ^ 0x8000000080008000 ^ ~uVar17 & uVar11;
    uVar34 = uVar14 >> 0x2b | uVar14 << 0x15;
    uVar32 = ~uVar34 & uVar19 ^ uVar11;
    uVar14 = ~uVar19 & uVar5 ^ uVar34;
    uVar34 = ~uVar11 & uVar34 ^ uVar17;
    uVar11 = uVar31 >> 3 | uVar31 << 0x3d;
    uVar19 = ~uVar5 & uVar17 ^ uVar19;
    uVar23 = uVar23 ^ uVar12;
    uVar9 = uVar23 >> 0x13 | uVar23 << 0x2d;
    uVar6 = uVar6 ^ uVar33;
    uVar31 = uVar6 >> 0x3d | uVar6 << 3;
    uVar24 = uVar24 ^ uVar37;
    uVar17 = uVar24 >> 0x24 | uVar24 << 0x1c;
    uVar40 = ~uVar11 & uVar17 ^ uVar9;
    uVar23 = ~uVar9 & uVar11 ^ uVar31;
    uVar1 = uVar1 ^ uVar3;
    uVar1 = uVar1 >> 0x2c | uVar1 << 0x14;
    uVar38 = ~uVar31 & uVar9 ^ uVar1;
    uVar9 = ~uVar1 & uVar31 ^ uVar17;
    uVar11 = ~uVar17 & uVar1 ^ uVar11;
    uVar16 = uVar16 ^ uVar3;
    uVar27 = uVar36 >> 0x2e | uVar36 << 0x12;
    uVar5 = uVar16 >> 0x38 | uVar16 << 8;
    uVar7 = uVar7 ^ uVar22;
    uVar8 = uVar8 ^ uVar37;
    uVar1 = uVar7 >> 0x3a | uVar7 << 6;
    uVar24 = uVar8 >> 0x27 | uVar8 << 0x19;
    uVar20 = uVar20 ^ uVar12;
    uVar7 = ~uVar5 & uVar27 ^ uVar24;
    uVar17 = uVar20 >> 0x3f | uVar20 << 1;
    uVar31 = ~uVar1 & uVar24 ^ uVar17;
    uVar6 = ~uVar24 & uVar5 ^ uVar1;
    uVar1 = ~uVar17 & uVar1 ^ uVar27;
    uVar5 = ~uVar27 & uVar17 ^ uVar5;
    uVar21 = uVar21 ^ uVar33;
    uVar33 = uVar33 ^ uVar18;
    uVar18 = uVar21 >> 0x1c | uVar21 << 0x24;
    uVar10 = uVar10 ^ uVar3;
    uVar3 = uVar3 ^ uVar2;
    uVar10 = uVar10 >> 0x25 | uVar10 << 0x1b;
    uVar15 = uVar15 ^ uVar12;
    uVar12 = uVar12 ^ uVar13;
    uVar3 = uVar3 >> 0x19 | uVar3 << 0x27;
    uVar17 = uVar15 >> 0x36 | uVar15 << 10;
    uVar29 = uVar29 ^ uVar22;
    uVar22 = uVar22 ^ uVar25;
    uVar25 = ~uVar18 & uVar17 ^ uVar10;
    uVar2 = uVar29 >> 0x31 | uVar29 << 0xf;
    uVar20 = uVar12 >> 0x3e | uVar12 << 2;
    uVar15 = ~uVar17 & uVar2 ^ uVar18;
    uVar35 = uVar35 ^ uVar37;
    uVar37 = uVar37 ^ uVar30;
    uVar13 = uVar35 >> 8 | uVar35 << 0x38;
    uVar17 = ~uVar2 & uVar13 ^ uVar17;
    uVar2 = ~uVar13 & uVar10 ^ uVar2;
    uVar13 = ~uVar10 & uVar18 ^ uVar13;
    uVar30 = uVar22 >> 2 | uVar22 << 0x3e;
    uVar10 = uVar37 >> 9 | uVar37 << 0x37;
    uVar29 = uVar33 >> 0x17 | uVar33 << 0x29;
    uVar24 = ~uVar20 & uVar30 ^ uVar29;
    uVar22 = ~uVar29 & uVar20 ^ uVar3;
    uVar21 = ~uVar3 & uVar29 ^ uVar10;
    uVar29 = uVar5 ^ uVar2 ^ uVar14 ^ uVar40 ^ uVar24;
    uVar20 = ~uVar30 & uVar10 ^ uVar20;
    uVar18 = uVar6 ^ uVar15 ^ uVar34 ^ uVar38 ^ uVar21;
    uVar30 = ~uVar10 & uVar3 ^ uVar30;
    uVar3 = uVar7 ^ uVar17 ^ uVar32 ^ uVar23 ^ uVar22;
    uVar10 = uVar1 ^ uVar13 ^ uVar19 ^ uVar11 ^ uVar20;
    uVar33 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar18;
    uVar16 = uVar31 ^ uVar25 ^ uVar39 ^ uVar9 ^ uVar30;
    uVar37 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar10;
    uVar7 = uVar7 ^ uVar33;
    uVar22 = uVar22 ^ uVar33;
    uVar28 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar3;
    uVar8 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar16;
    uVar18 = uVar22 >> 3 | uVar22 << 0x3d;
    uVar30 = uVar30 ^ uVar37;
    uVar29 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar29;
    uVar2 = uVar2 ^ uVar28;
    uVar38 = uVar38 ^ uVar8;
    uVar20 = uVar20 ^ uVar29;
    uVar22 = uVar38 >> 0x14 | uVar38 << 0x2c;
    uVar26 = uVar7 >> 0x15 | uVar7 << 0x2b;
    uVar2 = uVar2 >> 0x2b | uVar2 << 0x15;
    uVar10 = uVar20 >> 0x32 | uVar20 << 0xe;
    uVar3 = ~uVar26 & uVar2 ^ uVar22;
    uVar39 = uVar39 ^ uVar37;
    uVar20 = ~uVar10 & uVar39 ^ uVar2;
    uVar12 = ~uVar2 & uVar10 ^ uVar26;
    uVar10 = ~uVar39 & uVar22 ^ uVar10;
    uVar11 = uVar11 ^ uVar29;
    uVar31 = uVar31 ^ uVar37;
    uVar15 = uVar15 ^ uVar8;
    uVar14 = uVar14 ^ uVar28;
    uVar16 = uVar11 >> 0x2c | uVar11 << 0x14;
    uVar7 = uVar31 >> 0x3d | uVar31 << 3;
    uVar36 = uVar15 >> 0x13 | uVar15 << 0x2d;
    uVar2 = uVar14 >> 0x24 | uVar14 << 0x1c;
    uVar31 = ~uVar36 & uVar18 ^ uVar7;
    uVar27 = ~uVar7 & uVar36 ^ uVar16;
    uVar36 = ~uVar18 & uVar2 ^ uVar36;
    uVar11 = uVar30 >> 0x2e | uVar30 << 0x12;
    uVar38 = ~uVar16 & uVar7 ^ uVar2;
    uVar18 = ~uVar2 & uVar16 ^ uVar18;
    uVar5 = uVar5 ^ uVar28;
    uVar34 = uVar34 ^ uVar8;
    uVar13 = uVar13 ^ uVar29;
    uVar7 = uVar5 >> 0x27 | uVar5 << 0x19;
    uVar2 = uVar34 >> 0x3f | uVar34 << 1;
    uVar34 = uVar13 >> 0x38 | uVar13 << 8;
    uVar16 = ~uVar34 & uVar11 ^ uVar7;
    uVar35 = ~uVar11 & uVar2 ^ uVar34;
    uVar23 = uVar23 ^ uVar33;
    uVar14 = uVar23 >> 0x3a | uVar23 << 6;
    uVar15 = ~uVar7 & uVar34 ^ uVar14;
    uVar13 = ~uVar14 & uVar7 ^ uVar2;
    uVar9 = uVar9 ^ uVar37;
    uVar37 = uVar37 ^ uVar25;
    uVar11 = ~uVar2 & uVar14 ^ uVar11;
    uVar23 = uVar9 >> 0x1c | uVar9 << 0x24;
    uVar6 = uVar6 ^ uVar8;
    uVar17 = uVar17 ^ uVar33;
    uVar33 = uVar33 ^ uVar32;
    uVar9 = uVar17 >> 0x31 | uVar17 << 0xf;
    uVar34 = uVar6 >> 0x36 | uVar6 << 10;
    uVar17 = ~uVar34 & uVar9 ^ uVar23;
    uVar24 = uVar24 ^ uVar28;
    uVar28 = uVar28 ^ uVar40;
    uVar14 = uVar24 >> 8 | uVar24 << 0x38;
    uVar2 = ~uVar9 & uVar14 ^ uVar34;
    uVar25 = uVar28 >> 9 | uVar28 << 0x37;
    uVar19 = uVar19 ^ uVar29;
    uVar29 = uVar29 ^ uVar1;
    uVar30 = uVar19 >> 0x25 | uVar19 << 0x1b;
    uVar9 = ~uVar14 & uVar30 ^ uVar9;
    uVar5 = uVar29 >> 0x19 | uVar29 << 0x27;
    uVar14 = ~uVar30 & uVar23 ^ uVar14;
    uVar30 = ~uVar23 & uVar34 ^ uVar30;
    uVar8 = uVar8 ^ uVar21;
    uVar1 = uVar33 >> 2 | uVar33 << 0x3e;
    uVar21 = ~uVar25 & uVar5 ^ uVar1;
    uVar33 = ~uVar22 & uVar26 ^ uVar39 ^ 0x808b;
    uVar19 = uVar8 >> 0x3e | uVar8 << 2;
    uVar29 = uVar30 ^ uVar21 ^ uVar38 ^ uVar13 ^ uVar33;
    uVar22 = uVar37 >> 0x17 | uVar37 << 0x29;
    uVar7 = ~uVar19 & uVar1 ^ uVar22;
    uVar23 = ~uVar1 & uVar25 ^ uVar19;
    uVar25 = ~uVar5 & uVar22 ^ uVar25;
    uVar34 = uVar35 ^ uVar9 ^ uVar20 ^ uVar36 ^ uVar7;
    uVar1 = uVar11 ^ uVar14 ^ uVar10 ^ uVar18 ^ uVar23;
    uVar5 = ~uVar22 & uVar19 ^ uVar5;
    uVar22 = uVar15 ^ uVar17 ^ uVar3 ^ uVar27 ^ uVar25;
    uVar19 = uVar16 ^ uVar2 ^ uVar12 ^ uVar31 ^ uVar5;
    uVar40 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar34;
    uVar34 = (uVar34 >> 0x3f | uVar34 << 1) ^ uVar22;
    uVar23 = uVar23 ^ uVar40;
    uVar6 = uVar23 >> 0x32 | uVar23 << 0xe;
    uVar23 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar1;
    uVar33 = uVar33 ^ uVar23;
    uVar24 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar19;
    uVar5 = uVar5 ^ uVar34;
    uVar29 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar29;
    uVar1 = uVar5 >> 3 | uVar5 << 0x3d;
    uVar27 = uVar27 ^ uVar29;
    uVar22 = uVar27 >> 0x14 | uVar27 << 0x2c;
    uVar16 = uVar16 ^ uVar34;
    uVar9 = uVar9 ^ uVar24;
    uVar19 = uVar16 >> 0x15 | uVar16 << 0x2b;
    uVar16 = uVar9 >> 0x2b | uVar9 << 0x15;
    uVar32 = uVar33 ^ 0x80000001 ^ ~uVar22 & uVar19;
    uVar5 = ~uVar16 & uVar6 ^ uVar19;
    uVar9 = ~uVar19 & uVar16 ^ uVar22;
    uVar22 = ~uVar33 & uVar22 ^ uVar6;
    uVar16 = ~uVar6 & uVar33 ^ uVar16;
    uVar13 = uVar13 ^ uVar23;
    uVar8 = uVar13 >> 0x3d | uVar13 << 3;
    uVar20 = uVar20 ^ uVar24;
    uVar19 = uVar20 >> 0x24 | uVar20 << 0x1c;
    uVar18 = uVar18 ^ uVar40;
    uVar18 = uVar18 >> 0x2c | uVar18 << 0x14;
    uVar17 = uVar17 ^ uVar29;
    uVar17 = uVar17 >> 0x13 | uVar17 << 0x2d;
    uVar6 = ~uVar1 & uVar19 ^ uVar17;
    uVar20 = ~uVar8 & uVar17 ^ uVar18;
    uVar33 = ~uVar17 & uVar1 ^ uVar8;
    uVar8 = ~uVar18 & uVar8 ^ uVar19;
    uVar1 = ~uVar19 & uVar18 ^ uVar1;
    uVar21 = uVar21 ^ uVar23;
    uVar39 = uVar21 >> 0x2e | uVar21 << 0x12;
    uVar35 = uVar35 ^ uVar24;
    uVar31 = uVar31 ^ uVar34;
    uVar18 = uVar35 >> 0x27 | uVar35 << 0x19;
    uVar14 = uVar14 ^ uVar40;
    uVar19 = uVar31 >> 0x3a | uVar31 << 6;
    uVar3 = uVar3 ^ uVar29;
    uVar35 = uVar14 >> 0x38 | uVar14 << 8;
    uVar17 = uVar3 >> 0x3f | uVar3 << 1;
    uVar27 = ~uVar35 & uVar39 ^ uVar18;
    uVar21 = ~uVar18 & uVar35 ^ uVar19;
    uVar35 = ~uVar39 & uVar17 ^ uVar35;
    uVar13 = ~uVar19 & uVar18 ^ uVar17;
    uVar39 = ~uVar17 & uVar19 ^ uVar39;
    uVar10 = uVar10 ^ uVar40;
    uVar40 = uVar40 ^ uVar11;
    uVar18 = uVar10 >> 0x25 | uVar10 << 0x1b;
    uVar38 = uVar38 ^ uVar23;
    uVar11 = uVar38 >> 0x1c | uVar38 << 0x24;
    uVar15 = uVar15 ^ uVar29;
    uVar19 = uVar15 >> 0x36 | uVar15 << 10;
    uVar17 = ~uVar11 & uVar19 ^ uVar18;
    uVar2 = uVar2 ^ uVar34;
    uVar34 = uVar34 ^ uVar12;
    uVar10 = uVar2 >> 0x31 | uVar2 << 0xf;
    uVar2 = ~uVar19 & uVar10 ^ uVar11;
    uVar7 = uVar7 ^ uVar24;
    uVar24 = uVar24 ^ uVar36;
    uVar14 = uVar7 >> 8 | uVar7 << 0x38;
    uVar19 = ~uVar10 & uVar14 ^ uVar19;
    uVar23 = uVar23 ^ uVar30;
    uVar10 = ~uVar14 & uVar18 ^ uVar10;
    uVar14 = ~uVar18 & uVar11 ^ uVar14;
    uVar3 = uVar34 >> 2 | uVar34 << 0x3e;
    uVar23 = uVar23 >> 0x17 | uVar23 << 0x29;
    uVar29 = uVar29 ^ uVar25;
    uVar11 = uVar24 >> 9 | uVar24 << 0x37;
    uVar34 = uVar40 >> 0x19 | uVar40 << 0x27;
    uVar31 = uVar29 >> 0x3e | uVar29 << 2;
    uVar40 = ~uVar34 & uVar23 ^ uVar11;
    uVar38 = ~uVar31 & uVar3 ^ uVar23;
    uVar18 = uVar21 ^ uVar2 ^ uVar9 ^ uVar20 ^ uVar40;
    uVar25 = uVar35 ^ uVar10 ^ uVar16 ^ uVar6 ^ uVar38;
    uVar12 = ~uVar11 & uVar34 ^ uVar3;
    uVar34 = ~uVar23 & uVar31 ^ uVar34;
    uVar23 = uVar13 ^ uVar17 ^ uVar32 ^ uVar8 ^ uVar12;
    uVar31 = ~uVar3 & uVar11 ^ uVar31;
    uVar3 = (uVar25 >> 0x3f | uVar25 << 1) ^ uVar18;
    uVar36 = uVar27 ^ uVar19 ^ uVar5 ^ uVar33 ^ uVar34;
    uVar29 = uVar39 ^ uVar14 ^ uVar22 ^ uVar1 ^ uVar31;
    uVar27 = uVar27 ^ uVar3;
    uVar25 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar25;
    uVar18 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar29;
    uVar23 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar23;
    uVar11 = uVar27 >> 0x15 | uVar27 << 0x2b;
    uVar36 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar36;
    uVar31 = uVar31 ^ uVar25;
    uVar34 = uVar34 ^ uVar3;
    uVar10 = uVar10 ^ uVar36;
    uVar24 = uVar10 >> 0x2b | uVar10 << 0x15;
    uVar32 = uVar32 ^ uVar18;
    uVar20 = uVar20 ^ uVar23;
    uVar10 = uVar20 >> 0x14 | uVar20 << 0x2c;
    uVar27 = uVar32 ^ 0x8000000080008081 ^ ~uVar10 & uVar11;
    uVar31 = uVar31 >> 0x32 | uVar31 << 0xe;
    uVar15 = uVar34 >> 3 | uVar34 << 0x3d;
    uVar29 = ~uVar24 & uVar31 ^ uVar11;
    uVar11 = ~uVar11 & uVar24 ^ uVar10;
    uVar24 = ~uVar31 & uVar32 ^ uVar24;
    uVar31 = ~uVar32 & uVar10 ^ uVar31;
    uVar2 = uVar2 ^ uVar23;
    uVar1 = uVar1 ^ uVar25;
    uVar16 = uVar16 ^ uVar36;
    uVar13 = uVar13 ^ uVar18;
    uVar2 = uVar2 >> 0x13 | uVar2 << 0x2d;
    uVar34 = uVar1 >> 0x2c | uVar1 << 0x14;
    uVar10 = uVar16 >> 0x24 | uVar16 << 0x1c;
    uVar1 = uVar13 >> 0x3d | uVar13 << 3;
    uVar16 = ~uVar2 & uVar15 ^ uVar1;
    uVar37 = ~uVar15 & uVar10 ^ uVar2;
    uVar7 = ~uVar34 & uVar1 ^ uVar10;
    uVar15 = ~uVar10 & uVar34 ^ uVar15;
    uVar34 = ~uVar1 & uVar2 ^ uVar34;
    uVar12 = uVar12 ^ uVar18;
    uVar20 = uVar12 >> 0x2e | uVar12 << 0x12;
    uVar35 = uVar35 ^ uVar36;
    uVar9 = uVar9 ^ uVar23;
    uVar14 = uVar14 ^ uVar25;
    uVar33 = uVar33 ^ uVar3;
    uVar12 = uVar35 >> 0x27 | uVar35 << 0x19;
    uVar1 = uVar9 >> 0x3f | uVar9 << 1;
    uVar14 = uVar14 >> 0x38 | uVar14 << 8;
    uVar2 = uVar33 >> 0x3a | uVar33 << 6;
    uVar10 = ~uVar20 & uVar1 ^ uVar14;
    uVar33 = ~uVar14 & uVar20 ^ uVar12;
    uVar9 = ~uVar12 & uVar14 ^ uVar2;
    uVar30 = ~uVar2 & uVar12 ^ uVar1;
    uVar20 = ~uVar1 & uVar2 ^ uVar20;
    uVar22 = uVar22 ^ uVar25;
    uVar25 = uVar25 ^ uVar39;
    uVar14 = uVar22 >> 0x25 | uVar22 << 0x1b;
    uVar8 = uVar8 ^ uVar18;
    uVar2 = uVar8 >> 0x1c | uVar8 << 0x24;
    uVar21 = uVar21 ^ uVar23;
    uVar23 = uVar23 ^ uVar40;
    uVar12 = uVar21 >> 0x36 | uVar21 << 10;
    uVar22 = ~uVar2 & uVar12 ^ uVar14;
    uVar19 = uVar19 ^ uVar3;
    uVar3 = uVar3 ^ uVar5;
    uVar5 = uVar19 >> 0x31 | uVar19 << 0xf;
    uVar19 = ~uVar12 & uVar5 ^ uVar2;
    uVar38 = uVar38 ^ uVar36;
    uVar36 = uVar36 ^ uVar6;
    uVar1 = uVar38 >> 8 | uVar38 << 0x38;
    uVar12 = ~uVar5 & uVar1 ^ uVar12;
    uVar5 = ~uVar1 & uVar14 ^ uVar5;
    uVar6 = uVar25 >> 0x19 | uVar25 << 0x27;
    uVar8 = uVar23 >> 0x3e | uVar23 << 2;
    uVar18 = uVar18 ^ uVar17;
    uVar1 = ~uVar14 & uVar2 ^ uVar1;
    uVar13 = uVar3 >> 2 | uVar3 << 0x3e;
    uVar3 = uVar36 >> 9 | uVar36 << 0x37;
    uVar17 = uVar18 >> 0x17 | uVar18 << 0x29;
    uVar14 = ~uVar8 & uVar13 ^ uVar17;
    uVar2 = ~uVar17 & uVar8 ^ uVar6;
    uVar8 = ~uVar13 & uVar3 ^ uVar8;
    uVar25 = ~uVar6 & uVar17 ^ uVar3;
    uVar13 = ~uVar3 & uVar6 ^ uVar13;
    uVar21 = uVar10 ^ uVar5 ^ uVar24 ^ uVar37 ^ uVar14;
    uVar3 = uVar20 ^ uVar1 ^ uVar31 ^ uVar15 ^ uVar8;
    uVar6 = uVar33 ^ uVar12 ^ uVar29 ^ uVar16 ^ uVar2;
    uVar23 = uVar9 ^ uVar19 ^ uVar11 ^ uVar34 ^ uVar25;
    uVar17 = uVar30 ^ uVar22 ^ uVar27 ^ uVar7 ^ uVar13;
    uVar18 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar23;
    uVar36 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar6;
    uVar38 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar17;
    uVar2 = uVar2 ^ uVar18;
    uVar3 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar3;
    uVar21 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar21;
    uVar5 = uVar5 ^ uVar36;
    uVar17 = uVar2 >> 3 | uVar2 << 0x3d;
    uVar8 = uVar8 ^ uVar21;
    uVar13 = uVar13 ^ uVar3;
    uVar27 = uVar27 ^ uVar3;
    uVar33 = uVar33 ^ uVar18;
    uVar5 = uVar5 >> 0x2b | uVar5 << 0x15;
    uVar6 = uVar33 >> 0x15 | uVar33 << 0x2b;
    uVar34 = uVar34 ^ uVar38;
    uVar34 = uVar34 >> 0x14 | uVar34 << 0x2c;
    uVar35 = uVar27 ^ 0x8000000000008009 ^ ~uVar34 & uVar6;
    uVar23 = uVar8 >> 0x32 | uVar8 << 0xe;
    uVar40 = ~uVar5 & uVar23 ^ uVar6;
    uVar2 = ~uVar23 & uVar27 ^ uVar5;
    uVar5 = ~uVar6 & uVar5 ^ uVar34;
    uVar23 = ~uVar27 & uVar34 ^ uVar23;
    uVar19 = uVar19 ^ uVar38;
    uVar15 = uVar15 ^ uVar21;
    uVar32 = uVar19 >> 0x13 | uVar19 << 0x2d;
    uVar34 = uVar15 >> 0x2c | uVar15 << 0x14;
    uVar30 = uVar30 ^ uVar3;
    uVar24 = uVar24 ^ uVar36;
    uVar15 = uVar30 >> 0x3d | uVar30 << 3;
    uVar6 = ~uVar32 & uVar17 ^ uVar15;
    uVar19 = uVar24 >> 0x24 | uVar24 << 0x1c;
    uVar8 = ~uVar34 & uVar15 ^ uVar19;
    uVar24 = ~uVar15 & uVar32 ^ uVar34;
    uVar32 = ~uVar17 & uVar19 ^ uVar32;
    uVar17 = ~uVar19 & uVar34 ^ uVar17;
    uVar10 = uVar10 ^ uVar36;
    uVar1 = uVar1 ^ uVar21;
    uVar11 = uVar11 ^ uVar38;
    uVar34 = uVar10 >> 0x27 | uVar10 << 0x19;
    uVar16 = uVar16 ^ uVar18;
    uVar33 = uVar1 >> 0x38 | uVar1 << 8;
    uVar19 = uVar13 >> 0x2e | uVar13 << 0x12;
    uVar10 = uVar11 >> 0x3f | uVar11 << 1;
    uVar1 = uVar16 >> 0x3a | uVar16 << 6;
    uVar13 = ~uVar33 & uVar19 ^ uVar34;
    uVar16 = ~uVar34 & uVar33 ^ uVar1;
    uVar33 = ~uVar19 & uVar10 ^ uVar33;
    uVar15 = ~uVar1 & uVar34 ^ uVar10;
    uVar19 = ~uVar10 & uVar1 ^ uVar19;
    uVar31 = uVar31 ^ uVar21;
    uVar21 = uVar21 ^ uVar20;
    uVar31 = uVar31 >> 0x25 | uVar31 << 0x1b;
    uVar7 = uVar7 ^ uVar3;
    uVar11 = uVar7 >> 0x1c | uVar7 << 0x24;
    uVar9 = uVar9 ^ uVar38;
    uVar38 = uVar38 ^ uVar25;
    uVar10 = uVar9 >> 0x36 | uVar9 << 10;
    uVar20 = ~uVar11 & uVar10 ^ uVar31;
    uVar12 = uVar12 ^ uVar18;
    uVar34 = uVar12 >> 0x31 | uVar12 << 0xf;
    uVar7 = ~uVar10 & uVar34 ^ uVar11;
    uVar14 = uVar14 ^ uVar36;
    uVar36 = uVar36 ^ uVar37;
    uVar1 = uVar14 >> 8 | uVar14 << 0x38;
    uVar9 = ~uVar31 & uVar11 ^ uVar1;
    uVar10 = ~uVar34 & uVar1 ^ uVar10;
    uVar18 = uVar18 ^ uVar29;
    uVar34 = ~uVar1 & uVar31 ^ uVar34;
    uVar3 = uVar3 ^ uVar22;
    uVar29 = uVar18 >> 2 | uVar18 << 0x3e;
    uVar1 = uVar36 >> 9 | uVar36 << 0x37;
    uVar18 = uVar3 >> 0x17 | uVar3 << 0x29;
    uVar11 = uVar21 >> 0x19 | uVar21 << 0x27;
    uVar22 = uVar38 >> 0x3e | uVar38 << 2;
    uVar31 = ~uVar22 & uVar29 ^ uVar18;
    uVar36 = ~uVar11 & uVar18 ^ uVar1;
    uVar14 = uVar16 ^ uVar7 ^ uVar5 ^ uVar24 ^ uVar36;
    uVar3 = uVar33 ^ uVar34 ^ uVar2 ^ uVar32 ^ uVar31;
    uVar12 = ~uVar18 & uVar22 ^ uVar11;
    uVar18 = ~uVar1 & uVar11 ^ uVar29;
    uVar39 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar14;
    uVar11 = uVar13 ^ uVar10 ^ uVar40 ^ uVar6 ^ uVar12;
    uVar22 = ~uVar29 & uVar1 ^ uVar22;
    uVar30 = uVar15 ^ uVar20 ^ uVar35 ^ uVar8 ^ uVar18;
    uVar12 = uVar12 ^ uVar39;
    uVar29 = uVar19 ^ uVar9 ^ uVar23 ^ uVar17 ^ uVar22;
    uVar1 = uVar12 >> 3 | uVar12 << 0x3d;
    uVar37 = (uVar14 >> 0x3f | uVar14 << 1) ^ uVar29;
    uVar3 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar3;
    uVar26 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar11;
    uVar22 = uVar22 ^ uVar3;
    uVar18 = uVar18 ^ uVar37;
    uVar9 = uVar9 ^ uVar3;
    uVar34 = uVar34 ^ uVar26;
    uVar35 = uVar35 ^ uVar37;
    uVar29 = uVar22 >> 0x32 | uVar22 << 0xe;
    uVar30 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar30;
    uVar11 = uVar18 >> 0x2e | uVar18 << 0x12;
    uVar22 = uVar34 >> 0x2b | uVar34 << 0x15;
    uVar13 = uVar13 ^ uVar39;
    uVar24 = uVar24 ^ uVar30;
    uVar38 = uVar13 >> 0x15 | uVar13 << 0x2b;
    uVar34 = uVar24 >> 0x14 | uVar24 << 0x2c;
    uVar14 = ~uVar29 & uVar35 ^ uVar22;
    uVar18 = ~uVar38 & uVar22 ^ uVar34;
    uVar13 = ~uVar22 & uVar29 ^ uVar38;
    uVar29 = ~uVar35 & uVar34 ^ uVar29;
    uVar2 = uVar2 ^ uVar26;
    uVar15 = uVar15 ^ uVar37;
    uVar22 = uVar2 >> 0x24 | uVar2 << 0x1c;
    uVar17 = uVar17 ^ uVar3;
    uVar24 = uVar15 >> 0x3d | uVar15 << 3;
    uVar2 = uVar17 >> 0x2c | uVar17 << 0x14;
    uVar7 = uVar7 ^ uVar30;
    uVar7 = uVar7 >> 0x13 | uVar7 << 0x2d;
    uVar15 = ~uVar1 & uVar22 ^ uVar7;
    uVar17 = ~uVar24 & uVar7 ^ uVar2;
    uVar21 = ~uVar7 & uVar1 ^ uVar24;
    uVar25 = ~uVar2 & uVar24 ^ uVar22;
    uVar1 = ~uVar22 & uVar2 ^ uVar1;
    uVar9 = uVar9 >> 0x38 | uVar9 << 8;
    uVar5 = uVar5 ^ uVar30;
    uVar22 = uVar5 >> 0x3f | uVar5 << 1;
    uVar33 = uVar33 ^ uVar26;
    uVar24 = uVar33 >> 0x27 | uVar33 << 0x19;
    uVar27 = ~uVar11 & uVar22 ^ uVar9;
    uVar7 = ~uVar9 & uVar11 ^ uVar24;
    uVar6 = uVar6 ^ uVar39;
    uVar2 = uVar6 >> 0x3a | uVar6 << 6;
    uVar12 = ~uVar24 & uVar9 ^ uVar2;
    uVar33 = ~uVar2 & uVar24 ^ uVar22;
    uVar11 = ~uVar22 & uVar2 ^ uVar11;
    uVar8 = uVar8 ^ uVar37;
    uVar37 = uVar37 ^ uVar20;
    uVar20 = uVar8 >> 0x1c | uVar8 << 0x24;
    uVar5 = uVar37 >> 0x17 | uVar37 << 0x29;
    uVar16 = uVar16 ^ uVar30;
    uVar30 = uVar30 ^ uVar36;
    uVar2 = uVar16 >> 0x36 | uVar16 << 10;
    uVar10 = uVar10 ^ uVar39;
    uVar39 = uVar39 ^ uVar40;
    uVar16 = uVar10 >> 0x31 | uVar10 << 0xf;
    uVar9 = ~uVar2 & uVar16 ^ uVar20;
    uVar10 = uVar39 >> 2 | uVar39 << 0x3e;
    uVar31 = uVar31 ^ uVar26;
    uVar26 = uVar26 ^ uVar32;
    uVar24 = uVar31 >> 8 | uVar31 << 0x38;
    uVar32 = ~uVar16 & uVar24 ^ uVar2;
    uVar31 = uVar26 >> 9 | uVar26 << 0x37;
    uVar23 = uVar23 ^ uVar3;
    uVar3 = uVar3 ^ uVar19;
    uVar22 = uVar23 >> 0x25 | uVar23 << 0x1b;
    uVar16 = ~uVar24 & uVar22 ^ uVar16;
    uVar6 = ~uVar20 & uVar2 ^ uVar22;
    uVar24 = ~uVar22 & uVar20 ^ uVar24;
    uVar36 = ~uVar34 & uVar38 ^ uVar35 ^ 0x8a;
    uVar22 = uVar3 >> 0x19 | uVar3 << 0x27;
    uVar3 = uVar30 >> 0x3e | uVar30 << 2;
    uVar30 = ~uVar31 & uVar22 ^ uVar10;
    uVar2 = ~uVar5 & uVar3 ^ uVar22;
    uVar20 = uVar7 ^ uVar32 ^ uVar13 ^ uVar21 ^ uVar2;
    uVar37 = ~uVar22 & uVar5 ^ uVar31;
    uVar5 = ~uVar3 & uVar10 ^ uVar5;
    uVar3 = ~uVar10 & uVar31 ^ uVar3;
    uVar35 = uVar27 ^ uVar16 ^ uVar14 ^ uVar15 ^ uVar5;
    uVar22 = uVar12 ^ uVar9 ^ uVar18 ^ uVar17 ^ uVar37;
    uVar10 = uVar11 ^ uVar24 ^ uVar29 ^ uVar1 ^ uVar3;
    uVar26 = (uVar35 >> 0x3f | uVar35 << 1) ^ uVar22;
    uVar19 = uVar6 ^ uVar30 ^ uVar25 ^ uVar33 ^ uVar36;
    uVar2 = uVar2 ^ uVar26;
    uVar22 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar10;
    uVar40 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar20;
    uVar20 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar19;
    uVar2 = uVar2 >> 3 | uVar2 << 0x3d;
    uVar36 = uVar36 ^ uVar22;
    uVar35 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar35;
    uVar16 = uVar16 ^ uVar40;
    uVar3 = uVar3 ^ uVar35;
    uVar19 = uVar16 >> 0x2b | uVar16 << 0x15;
    uVar10 = uVar3 >> 0x32 | uVar3 << 0xe;
    uVar7 = uVar7 ^ uVar26;
    uVar17 = uVar17 ^ uVar20;
    uVar38 = uVar7 >> 0x15 | uVar7 << 0x2b;
    uVar17 = uVar17 >> 0x14 | uVar17 << 0x2c;
    uVar23 = ~uVar10 & uVar36 ^ uVar19;
    uVar34 = ~uVar38 & uVar19 ^ uVar17;
    uVar16 = ~uVar19 & uVar10 ^ uVar38;
    uVar10 = ~uVar36 & uVar17 ^ uVar10;
    uVar1 = uVar1 ^ uVar35;
    uVar39 = uVar1 >> 0x2c | uVar1 << 0x14;
    uVar14 = uVar14 ^ uVar40;
    uVar9 = uVar9 ^ uVar20;
    uVar19 = uVar14 >> 0x24 | uVar14 << 0x1c;
    uVar14 = uVar9 >> 0x13 | uVar9 << 0x2d;
    uVar33 = uVar33 ^ uVar22;
    uVar1 = uVar33 >> 0x3d | uVar33 << 3;
    uVar8 = ~uVar2 & uVar19 ^ uVar14;
    uVar3 = ~uVar1 & uVar14 ^ uVar39;
    uVar31 = ~uVar14 & uVar2 ^ uVar1;
    uVar7 = ~uVar39 & uVar1 ^ uVar19;
    uVar2 = ~uVar19 & uVar39 ^ uVar2;
    uVar21 = uVar21 ^ uVar26;
    uVar14 = uVar21 >> 0x3a | uVar21 << 6;
    uVar18 = uVar18 ^ uVar20;
    uVar19 = uVar18 >> 0x3f | uVar18 << 1;
    uVar27 = uVar27 ^ uVar40;
    uVar18 = uVar27 >> 0x27 | uVar27 << 0x19;
    uVar24 = uVar24 ^ uVar35;
    uVar21 = uVar24 >> 0x38 | uVar24 << 8;
    uVar30 = uVar30 ^ uVar22;
    uVar1 = uVar30 >> 0x2e | uVar30 << 0x12;
    uVar33 = ~uVar18 & uVar21 ^ uVar14;
    uVar39 = ~uVar21 & uVar1 ^ uVar18;
    uVar21 = ~uVar1 & uVar19 ^ uVar21;
    uVar30 = ~uVar14 & uVar18 ^ uVar19;
    uVar1 = ~uVar19 & uVar14 ^ uVar1;
    uVar32 = uVar32 ^ uVar26;
    uVar26 = uVar26 ^ uVar13;
    uVar9 = uVar32 >> 0x31 | uVar32 << 0xf;
    uVar25 = uVar25 ^ uVar22;
    uVar24 = uVar25 >> 0x1c | uVar25 << 0x24;
    uVar12 = uVar12 ^ uVar20;
    uVar12 = uVar12 >> 0x36 | uVar12 << 10;
    uVar19 = ~uVar12 & uVar9 ^ uVar24;
    uVar5 = uVar5 ^ uVar40;
    uVar40 = uVar40 ^ uVar15;
    uVar18 = uVar5 >> 8 | uVar5 << 0x38;
    uVar14 = ~uVar9 & uVar18 ^ uVar12;
    uVar29 = uVar29 ^ uVar35;
    uVar35 = uVar35 ^ uVar11;
    uVar29 = uVar29 >> 0x25 | uVar29 << 0x1b;
    uVar15 = uVar40 >> 9 | uVar40 << 0x37;
    uVar27 = ~uVar24 & uVar12 ^ uVar29;
    uVar12 = ~uVar29 & uVar24 ^ uVar18;
    uVar9 = ~uVar18 & uVar29 ^ uVar9;
    uVar22 = uVar22 ^ uVar6;
    uVar29 = uVar35 >> 0x19 | uVar35 << 0x27;
    uVar20 = uVar20 ^ uVar37;
    uVar11 = uVar26 >> 2 | uVar26 << 0x3e;
    uVar13 = ~uVar15 & uVar29 ^ uVar11;
    uVar32 = uVar22 >> 0x17 | uVar22 << 0x29;
    uVar37 = ~uVar17 & uVar38 ^ uVar36 ^ 0x88;
    uVar17 = uVar20 >> 0x3e | uVar20 << 2;
    uVar35 = ~uVar29 & uVar32 ^ uVar15;
    uVar18 = uVar33 ^ uVar19 ^ uVar34 ^ uVar3 ^ uVar35;
    uVar5 = uVar27 ^ uVar13 ^ uVar7 ^ uVar30 ^ uVar37;
    uVar29 = ~uVar32 & uVar17 ^ uVar29;
    uVar22 = ~uVar11 & uVar15 ^ uVar17;
    uVar32 = ~uVar17 & uVar11 ^ uVar32;
    uVar11 = uVar39 ^ uVar14 ^ uVar16 ^ uVar31 ^ uVar29;
    uVar20 = uVar1 ^ uVar12 ^ uVar10 ^ uVar2 ^ uVar22;
    uVar17 = uVar21 ^ uVar9 ^ uVar23 ^ uVar8 ^ uVar32;
    uVar36 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar20;
    uVar26 = (uVar5 >> 0x3f | uVar5 << 1) ^ uVar17;
    uVar18 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar18;
    uVar40 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar11;
    uVar22 = uVar22 ^ uVar26;
    uVar37 = uVar37 ^ uVar36;
    uVar5 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar5;
    uVar9 = uVar9 ^ uVar40;
    uVar22 = uVar22 >> 0x32 | uVar22 << 0xe;
    uVar29 = uVar29 ^ uVar18;
    uVar3 = uVar3 ^ uVar5;
    uVar17 = uVar29 >> 3 | uVar29 << 0x3d;
    uVar29 = uVar3 >> 0x14 | uVar3 << 0x2c;
    uVar39 = uVar39 ^ uVar18;
    uVar6 = uVar9 >> 0x2b | uVar9 << 0x15;
    uVar11 = uVar39 >> 0x15 | uVar39 << 0x2b;
    uVar38 = ~uVar6 & uVar22 ^ uVar11;
    uVar24 = ~uVar11 & uVar6 ^ uVar29;
    uVar25 = uVar37 ^ 0x80008009 ^ ~uVar29 & uVar11;
    uVar29 = ~uVar37 & uVar29 ^ uVar22;
    uVar6 = ~uVar22 & uVar37 ^ uVar6;
    uVar30 = uVar30 ^ uVar36;
    uVar23 = uVar23 ^ uVar40;
    uVar20 = uVar30 >> 0x3d | uVar30 << 3;
    uVar22 = uVar23 >> 0x24 | uVar23 << 0x1c;
    uVar19 = uVar19 ^ uVar5;
    uVar11 = uVar19 >> 0x13 | uVar19 << 0x2d;
    uVar30 = ~uVar17 & uVar22 ^ uVar11;
    uVar23 = ~uVar11 & uVar17 ^ uVar20;
    uVar2 = uVar2 ^ uVar26;
    uVar19 = uVar2 >> 0x2c | uVar2 << 0x14;
    uVar11 = ~uVar20 & uVar11 ^ uVar19;
    uVar9 = ~uVar19 & uVar20 ^ uVar22;
    uVar13 = uVar13 ^ uVar36;
    uVar17 = ~uVar22 & uVar19 ^ uVar17;
    uVar19 = uVar13 >> 0x2e | uVar13 << 0x12;
    uVar12 = uVar12 ^ uVar26;
    uVar21 = uVar21 ^ uVar40;
    uVar15 = uVar12 >> 0x38 | uVar12 << 8;
    uVar20 = uVar21 >> 0x27 | uVar21 << 0x19;
    uVar31 = uVar31 ^ uVar18;
    uVar34 = uVar34 ^ uVar5;
    uVar2 = uVar31 >> 0x3a | uVar31 << 6;
    uVar12 = ~uVar15 & uVar19 ^ uVar20;
    uVar22 = uVar34 >> 0x3f | uVar34 << 1;
    uVar34 = ~uVar20 & uVar15 ^ uVar2;
    uVar13 = ~uVar2 & uVar20 ^ uVar22;
    uVar15 = ~uVar19 & uVar22 ^ uVar15;
    uVar19 = ~uVar22 & uVar2 ^ uVar19;
    uVar7 = uVar7 ^ uVar36;
    uVar10 = uVar10 ^ uVar26;
    uVar2 = uVar7 >> 0x1c | uVar7 << 0x24;
    uVar26 = uVar26 ^ uVar1;
    uVar3 = uVar10 >> 0x25 | uVar10 << 0x1b;
    uVar32 = uVar32 ^ uVar40;
    uVar40 = uVar40 ^ uVar8;
    uVar14 = uVar14 ^ uVar18;
    uVar33 = uVar33 ^ uVar5;
    uVar20 = uVar14 >> 0x31 | uVar14 << 0xf;
    uVar31 = uVar33 >> 0x36 | uVar33 << 10;
    uVar22 = ~uVar2 & uVar31 ^ uVar3;
    uVar10 = ~uVar31 & uVar20 ^ uVar2;
    uVar1 = uVar32 >> 8 | uVar32 << 0x38;
    uVar33 = ~uVar3 & uVar2 ^ uVar1;
    uVar31 = ~uVar20 & uVar1 ^ uVar31;
    uVar20 = ~uVar1 & uVar3 ^ uVar20;
    uVar21 = uVar26 >> 0x19 | uVar26 << 0x27;
    uVar7 = uVar40 >> 9 | uVar40 << 0x37;
    uVar18 = uVar18 ^ uVar16;
    uVar36 = uVar36 ^ uVar27;
    uVar1 = uVar18 >> 2 | uVar18 << 0x3e;
    uVar2 = uVar36 >> 0x17 | uVar36 << 0x29;
    uVar36 = ~uVar21 & uVar2 ^ uVar7;
    uVar18 = uVar34 ^ uVar10 ^ uVar24 ^ uVar11 ^ uVar36;
    uVar5 = uVar5 ^ uVar35;
    uVar3 = uVar5 >> 0x3e | uVar5 << 2;
    uVar8 = ~uVar3 & uVar1 ^ uVar2;
    uVar14 = ~uVar2 & uVar3 ^ uVar21;
    uVar5 = uVar15 ^ uVar20 ^ uVar6 ^ uVar30 ^ uVar8;
    uVar2 = uVar12 ^ uVar31 ^ uVar38 ^ uVar23 ^ uVar14;
    uVar16 = ~uVar7 & uVar21 ^ uVar1;
    uVar3 = ~uVar1 & uVar7 ^ uVar3;
    uVar21 = (uVar5 >> 0x3f | uVar5 << 1) ^ uVar18;
    uVar7 = uVar13 ^ uVar22 ^ uVar25 ^ uVar9 ^ uVar16;
    uVar1 = uVar19 ^ uVar33 ^ uVar29 ^ uVar17 ^ uVar3;
    uVar35 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar7;
    uVar14 = uVar14 ^ uVar21;
    uVar32 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar1;
    uVar14 = uVar14 >> 3 | uVar14 << 0x3d;
    uVar2 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar2;
    uVar25 = uVar25 ^ uVar32;
    uVar16 = uVar16 ^ uVar32;
    uVar5 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar5;
    uVar20 = uVar20 ^ uVar2;
    uVar18 = uVar16 >> 0x2e | uVar16 << 0x12;
    uVar3 = uVar3 ^ uVar5;
    uVar20 = uVar20 >> 0x2b | uVar20 << 0x15;
    uVar3 = uVar3 >> 0x32 | uVar3 << 0xe;
    uVar11 = uVar11 ^ uVar35;
    uVar12 = uVar12 ^ uVar21;
    uVar7 = uVar12 >> 0x15 | uVar12 << 0x2b;
    uVar1 = uVar11 >> 0x14 | uVar11 << 0x2c;
    uVar39 = ~uVar20 & uVar3 ^ uVar7;
    uVar16 = ~uVar7 & uVar20 ^ uVar1;
    uVar27 = uVar25 ^ 0x8000000a ^ ~uVar1 & uVar7;
    uVar1 = ~uVar25 & uVar1 ^ uVar3;
    uVar20 = ~uVar3 & uVar25 ^ uVar20;
    uVar6 = uVar6 ^ uVar2;
    uVar11 = uVar6 >> 0x24 | uVar6 << 0x1c;
    uVar17 = uVar17 ^ uVar5;
    uVar10 = uVar10 ^ uVar35;
    uVar17 = uVar17 >> 0x2c | uVar17 << 0x14;
    uVar10 = uVar10 >> 0x13 | uVar10 << 0x2d;
    uVar25 = ~uVar14 & uVar11 ^ uVar10;
    uVar13 = uVar13 ^ uVar32;
    uVar7 = uVar13 >> 0x3d | uVar13 << 3;
    uVar12 = ~uVar17 & uVar7 ^ uVar11;
    uVar3 = ~uVar7 & uVar10 ^ uVar17;
    uVar7 = ~uVar10 & uVar14 ^ uVar7;
    uVar14 = ~uVar11 & uVar17 ^ uVar14;
    uVar24 = uVar24 ^ uVar35;
    uVar15 = uVar15 ^ uVar2;
    uVar17 = uVar24 >> 0x3f | uVar24 << 1;
    uVar33 = uVar33 ^ uVar5;
    uVar11 = uVar15 >> 0x27 | uVar15 << 0x19;
    uVar24 = uVar33 >> 0x38 | uVar33 << 8;
    uVar33 = ~uVar18 & uVar17 ^ uVar24;
    uVar6 = ~uVar24 & uVar18 ^ uVar11;
    uVar23 = uVar23 ^ uVar21;
    uVar10 = uVar23 >> 0x3a | uVar23 << 6;
    uVar23 = ~uVar11 & uVar24 ^ uVar10;
    uVar24 = ~uVar10 & uVar11 ^ uVar17;
    uVar18 = ~uVar17 & uVar10 ^ uVar18;
    uVar29 = uVar29 ^ uVar5;
    uVar5 = uVar5 ^ uVar19;
    uVar15 = uVar29 >> 0x25 | uVar29 << 0x1b;
    uVar9 = uVar9 ^ uVar32;
    uVar17 = uVar9 >> 0x1c | uVar9 << 0x24;
    uVar34 = uVar34 ^ uVar35;
    uVar35 = uVar35 ^ uVar36;
    uVar13 = uVar34 >> 0x36 | uVar34 << 10;
    uVar11 = ~uVar17 & uVar13 ^ uVar15;
    uVar31 = uVar31 ^ uVar21;
    uVar10 = uVar31 >> 0x31 | uVar31 << 0xf;
    uVar34 = ~uVar13 & uVar10 ^ uVar17;
    uVar8 = uVar8 ^ uVar2;
    uVar2 = uVar2 ^ uVar30;
    uVar29 = uVar8 >> 8 | uVar8 << 0x38;
    uVar8 = ~uVar15 & uVar17 ^ uVar29;
    uVar13 = ~uVar10 & uVar29 ^ uVar13;
    uVar17 = uVar2 >> 9 | uVar2 << 0x37;
    uVar19 = uVar5 >> 0x19 | uVar5 << 0x27;
    uVar10 = ~uVar29 & uVar15 ^ uVar10;
    uVar21 = uVar21 ^ uVar38;
    uVar32 = uVar32 ^ uVar22;
    uVar29 = uVar21 >> 2 | uVar21 << 0x3e;
    uVar5 = uVar35 >> 0x3e | uVar35 << 2;
    uVar22 = uVar32 >> 0x17 | uVar32 << 0x29;
    uVar30 = ~uVar5 & uVar29 ^ uVar22;
    uVar9 = ~uVar22 & uVar5 ^ uVar19;
    uVar21 = uVar33 ^ uVar10 ^ uVar20 ^ uVar25 ^ uVar30;
    uVar38 = ~uVar19 & uVar22 ^ uVar17;
    uVar31 = ~uVar17 & uVar19 ^ uVar29;
    uVar5 = ~uVar29 & uVar17 ^ uVar5;
    uVar22 = uVar23 ^ uVar34 ^ uVar16 ^ uVar3 ^ uVar38;
    uVar35 = uVar6 ^ uVar13 ^ uVar39 ^ uVar7 ^ uVar9;
    uVar19 = uVar24 ^ uVar11 ^ uVar27 ^ uVar12 ^ uVar31;
    uVar29 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar22;
    uVar17 = uVar18 ^ uVar8 ^ uVar1 ^ uVar14 ^ uVar5;
    uVar2 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar17;
    uVar15 = (uVar35 >> 0x3f | uVar35 << 1) ^ uVar19;
    uVar6 = uVar6 ^ uVar29;
    uVar21 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar21;
    uVar35 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar35;
    uVar22 = uVar6 >> 0x15 | uVar6 << 0x2b;
    uVar9 = uVar9 ^ uVar29;
    uVar31 = uVar31 ^ uVar2;
    uVar10 = uVar10 ^ uVar35;
    uVar5 = uVar5 ^ uVar21;
    uVar19 = uVar9 >> 3 | uVar9 << 0x3d;
    uVar32 = uVar31 >> 0x2e | uVar31 << 0x12;
    uVar31 = uVar10 >> 0x2b | uVar10 << 0x15;
    uVar17 = uVar5 >> 0x32 | uVar5 << 0xe;
    uVar27 = uVar27 ^ uVar2;
    uVar3 = uVar3 ^ uVar15;
    uVar10 = uVar3 >> 0x14 | uVar3 << 0x2c;
    uVar9 = uVar27 ^ 0x8000808b ^ ~uVar10 & uVar22;
    uVar3 = ~uVar17 & uVar27 ^ uVar31;
    uVar5 = ~uVar31 & uVar17 ^ uVar22;
    uVar22 = ~uVar22 & uVar31 ^ uVar10;
    uVar17 = ~uVar27 & uVar10 ^ uVar17;
    uVar24 = uVar24 ^ uVar2;
    uVar24 = uVar24 >> 0x3d | uVar24 << 3;
    uVar14 = uVar14 ^ uVar21;
    uVar14 = uVar14 >> 0x2c | uVar14 << 0x14;
    uVar20 = uVar20 ^ uVar35;
    uVar10 = uVar20 >> 0x24 | uVar20 << 0x1c;
    uVar34 = uVar34 ^ uVar15;
    uVar20 = uVar34 >> 0x13 | uVar34 << 0x2d;
    uVar6 = ~uVar19 & uVar10 ^ uVar20;
    uVar31 = ~uVar24 & uVar20 ^ uVar14;
    uVar20 = ~uVar20 & uVar19 ^ uVar24;
    uVar34 = ~uVar14 & uVar24 ^ uVar10;
    uVar19 = ~uVar10 & uVar14 ^ uVar19;
    uVar33 = uVar33 ^ uVar35;
    uVar16 = uVar16 ^ uVar15;
    uVar33 = uVar33 >> 0x27 | uVar33 << 0x19;
    uVar10 = uVar16 >> 0x3f | uVar16 << 1;
    uVar8 = uVar8 ^ uVar21;
    uVar24 = uVar8 >> 0x38 | uVar8 << 8;
    uVar8 = ~uVar32 & uVar10 ^ uVar24;
    uVar7 = uVar7 ^ uVar29;
    uVar14 = uVar7 >> 0x3a | uVar7 << 6;
    uVar27 = ~uVar24 & uVar32 ^ uVar33;
    uVar24 = ~uVar33 & uVar24 ^ uVar14;
    uVar32 = ~uVar10 & uVar14 ^ uVar32;
    uVar10 = ~uVar14 & uVar33 ^ uVar10;
    uVar30 = uVar30 ^ uVar35;
    uVar35 = uVar35 ^ uVar25;
    uVar1 = uVar1 ^ uVar21;
    uVar21 = uVar21 ^ uVar18;
    uVar33 = uVar1 >> 0x25 | uVar1 << 0x1b;
    uVar12 = uVar12 ^ uVar2;
    uVar7 = uVar12 >> 0x1c | uVar12 << 0x24;
    uVar23 = uVar23 ^ uVar15;
    uVar15 = uVar15 ^ uVar38;
    uVar1 = uVar23 >> 0x36 | uVar23 << 10;
    uVar12 = ~uVar7 & uVar1 ^ uVar33;
    uVar13 = uVar13 ^ uVar29;
    uVar29 = uVar29 ^ uVar39;
    uVar18 = uVar13 >> 0x31 | uVar13 << 0xf;
    uVar16 = ~uVar1 & uVar18 ^ uVar7;
    uVar14 = uVar30 >> 8 | uVar30 << 0x38;
    uVar13 = ~uVar33 & uVar7 ^ uVar14;
    uVar1 = ~uVar18 & uVar14 ^ uVar1;
    uVar30 = uVar29 >> 2 | uVar29 << 0x3e;
    uVar7 = uVar21 >> 0x19 | uVar21 << 0x27;
    uVar18 = ~uVar14 & uVar33 ^ uVar18;
    uVar2 = uVar2 ^ uVar11;
    uVar29 = uVar35 >> 9 | uVar35 << 0x37;
    uVar11 = uVar15 >> 0x3e | uVar15 << 2;
    uVar33 = ~uVar29 & uVar7 ^ uVar30;
    uVar15 = uVar10 ^ uVar12 ^ uVar9 ^ uVar34 ^ uVar33;
    uVar2 = uVar2 >> 0x17 | uVar2 << 0x29;
    uVar23 = ~uVar11 & uVar30 ^ uVar2;
    uVar14 = ~uVar2 & uVar11 ^ uVar7;
    uVar39 = ~uVar7 & uVar2 ^ uVar29;
    uVar2 = uVar8 ^ uVar18 ^ uVar3 ^ uVar6 ^ uVar23;
    uVar11 = ~uVar30 & uVar29 ^ uVar11;
    uVar29 = uVar24 ^ uVar16 ^ uVar22 ^ uVar31 ^ uVar39;
    uVar21 = uVar27 ^ uVar1 ^ uVar5 ^ uVar20 ^ uVar14;
    uVar40 = (uVar15 >> 0x3f | uVar15 << 1) ^ uVar2;
    uVar36 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar29;
    uVar2 = uVar32 ^ uVar13 ^ uVar17 ^ uVar19 ^ uVar11;
    uVar15 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar15;
    uVar29 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar2;
    uVar11 = uVar11 ^ uVar40;
    uVar14 = uVar14 ^ uVar36;
    uVar21 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar21;
    uVar11 = uVar11 >> 0x32 | uVar11 << 0xe;
    uVar14 = uVar14 >> 3 | uVar14 << 0x3d;
    uVar33 = uVar33 ^ uVar29;
    uVar18 = uVar18 ^ uVar21;
    uVar18 = uVar18 >> 0x2b | uVar18 << 0x15;
    uVar31 = uVar31 ^ uVar15;
    uVar9 = uVar9 ^ uVar29;
    uVar2 = uVar31 >> 0x14 | uVar31 << 0x2c;
    uVar27 = uVar27 ^ uVar36;
    uVar7 = uVar27 >> 0x15 | uVar27 << 0x2b;
    uVar35 = ~uVar18 & uVar11 ^ uVar7;
    uVar31 = ~uVar7 & uVar18 ^ uVar2;
    uVar25 = uVar9 ^ 0x800000000000008b ^ ~uVar2 & uVar7;
    uVar18 = ~uVar11 & uVar9 ^ uVar18;
    uVar11 = ~uVar9 & uVar2 ^ uVar11;
    uVar3 = uVar3 ^ uVar21;
    uVar10 = uVar10 ^ uVar29;
    uVar16 = uVar16 ^ uVar15;
    uVar2 = uVar3 >> 0x24 | uVar3 << 0x1c;
    uVar3 = uVar10 >> 0x3d | uVar10 << 3;
    uVar16 = uVar16 >> 0x13 | uVar16 << 0x2d;
    uVar38 = ~uVar14 & uVar2 ^ uVar16;
    uVar7 = ~uVar16 & uVar14 ^ uVar3;
    uVar19 = uVar19 ^ uVar40;
    uVar10 = uVar33 >> 0x2e | uVar33 << 0x12;
    uVar19 = uVar19 >> 0x2c | uVar19 << 0x14;
    uVar16 = ~uVar3 & uVar16 ^ uVar19;
    uVar33 = ~uVar19 & uVar3 ^ uVar2;
    uVar14 = ~uVar2 & uVar19 ^ uVar14;
    uVar13 = uVar13 ^ uVar40;
    uVar3 = uVar13 >> 0x38 | uVar13 << 8;
    uVar20 = uVar20 ^ uVar36;
    uVar22 = uVar22 ^ uVar15;
    uVar19 = uVar20 >> 0x3a | uVar20 << 6;
    uVar22 = uVar22 >> 0x3f | uVar22 << 1;
    uVar13 = ~uVar10 & uVar22 ^ uVar3;
    uVar8 = uVar8 ^ uVar21;
    uVar20 = uVar8 >> 0x27 | uVar8 << 0x19;
    uVar2 = ~uVar3 & uVar10 ^ uVar20;
    uVar30 = ~uVar20 & uVar3 ^ uVar19;
    uVar9 = ~uVar19 & uVar20 ^ uVar22;
    uVar10 = ~uVar22 & uVar19 ^ uVar10;
    uVar17 = uVar17 ^ uVar40;
    uVar40 = uVar40 ^ uVar32;
    uVar3 = uVar17 >> 0x25 | uVar17 << 0x1b;
    uVar34 = uVar34 ^ uVar29;
    uVar17 = uVar34 >> 0x1c | uVar34 << 0x24;
    uVar24 = uVar24 ^ uVar15;
    uVar15 = uVar15 ^ uVar39;
    uVar34 = uVar24 >> 0x36 | uVar24 << 10;
    uVar20 = ~uVar17 & uVar34 ^ uVar3;
    uVar1 = uVar1 ^ uVar36;
    uVar36 = uVar36 ^ uVar5;
    uVar24 = uVar1 >> 0x31 | uVar1 << 0xf;
    uVar19 = ~uVar34 & uVar24 ^ uVar17;
    uVar23 = uVar23 ^ uVar21;
    uVar21 = uVar21 ^ uVar6;
    uVar22 = uVar23 >> 8 | uVar23 << 0x38;
    uVar27 = ~uVar3 & uVar17 ^ uVar22;
    uVar34 = ~uVar24 & uVar22 ^ uVar34;
    uVar23 = uVar15 >> 0x3e | uVar15 << 2;
    uVar17 = uVar40 >> 0x19 | uVar40 << 0x27;
    uVar24 = ~uVar22 & uVar3 ^ uVar24;
    uVar29 = uVar29 ^ uVar12;
    uVar22 = uVar21 >> 9 | uVar21 << 0x37;
    uVar12 = uVar29 >> 0x17 | uVar29 << 0x29;
    uVar37 = ~uVar12 & uVar23 ^ uVar17;
    uVar39 = ~uVar17 & uVar12 ^ uVar22;
    uVar29 = uVar36 >> 2 | uVar36 << 0x3e;
    uVar1 = uVar30 ^ uVar19 ^ uVar31 ^ uVar16 ^ uVar39;
    uVar8 = uVar2 ^ uVar34 ^ uVar35 ^ uVar7 ^ uVar37;
    uVar6 = ~uVar22 & uVar17 ^ uVar29;
    uVar12 = ~uVar23 & uVar29 ^ uVar12;
    uVar17 = uVar9 ^ uVar20 ^ uVar25 ^ uVar33 ^ uVar6;
    uVar3 = uVar13 ^ uVar24 ^ uVar18 ^ uVar38 ^ uVar12;
    uVar15 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar17;
    uVar23 = ~uVar29 & uVar22 ^ uVar23;
    uVar29 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar1;
    uVar22 = uVar10 ^ uVar27 ^ uVar11 ^ uVar14 ^ uVar23;
    uVar3 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar3;
    uVar32 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar22;
    uVar37 = uVar37 ^ uVar29;
    uVar8 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar8;
    uVar25 = uVar25 ^ uVar32;
    uVar23 = uVar23 ^ uVar3;
    uVar24 = uVar24 ^ uVar8;
    uVar16 = uVar16 ^ uVar15;
    uVar22 = uVar16 >> 0x14 | uVar16 << 0x2c;
    uVar2 = uVar2 ^ uVar29;
    uVar1 = uVar2 >> 0x15 | uVar2 << 0x2b;
    uVar21 = uVar25 ^ 0x8000000000008089 ^ ~uVar22 & uVar1;
    uVar2 = uVar24 >> 0x2b | uVar24 << 0x15;
    uVar17 = uVar23 >> 0x32 | uVar23 << 0xe;
    uVar40 = ~uVar2 & uVar17 ^ uVar1;
    uVar5 = ~uVar17 & uVar25 ^ uVar2;
    uVar23 = ~uVar1 & uVar2 ^ uVar22;
    uVar6 = uVar6 ^ uVar32;
    uVar17 = ~uVar25 & uVar22 ^ uVar17;
    uVar1 = uVar6 >> 0x2e | uVar6 << 0x12;
    uVar18 = uVar18 ^ uVar8;
    uVar22 = uVar18 >> 0x24 | uVar18 << 0x1c;
    uVar14 = uVar14 ^ uVar3;
    uVar19 = uVar19 ^ uVar15;
    uVar2 = uVar14 >> 0x2c | uVar14 << 0x14;
    uVar14 = uVar19 >> 0x13 | uVar19 << 0x2d;
    uVar9 = uVar9 ^ uVar32;
    uVar19 = uVar37 >> 3 | uVar37 << 0x3d;
    uVar24 = uVar9 >> 0x3d | uVar9 << 3;
    uVar25 = ~uVar19 & uVar22 ^ uVar14;
    uVar6 = ~uVar2 & uVar24 ^ uVar22;
    uVar16 = ~uVar24 & uVar14 ^ uVar2;
    uVar24 = ~uVar14 & uVar19 ^ uVar24;
    uVar19 = ~uVar22 & uVar2 ^ uVar19;
    uVar31 = uVar31 ^ uVar15;
    uVar13 = uVar13 ^ uVar8;
    uVar22 = uVar31 >> 0x3f | uVar31 << 1;
    uVar27 = uVar27 ^ uVar3;
    uVar14 = uVar13 >> 0x27 | uVar13 << 0x19;
    uVar18 = uVar27 >> 0x38 | uVar27 << 8;
    uVar9 = ~uVar1 & uVar22 ^ uVar18;
    uVar7 = uVar7 ^ uVar29;
    uVar31 = ~uVar18 & uVar1 ^ uVar14;
    uVar2 = uVar7 >> 0x3a | uVar7 << 6;
    uVar36 = ~uVar14 & uVar18 ^ uVar2;
    uVar7 = ~uVar2 & uVar14 ^ uVar22;
    uVar1 = ~uVar22 & uVar2 ^ uVar1;
    uVar11 = uVar11 ^ uVar3;
    uVar14 = uVar11 >> 0x25 | uVar11 << 0x1b;
    uVar3 = uVar3 ^ uVar10;
    uVar33 = uVar33 ^ uVar32;
    uVar11 = uVar33 >> 0x1c | uVar33 << 0x24;
    uVar30 = uVar30 ^ uVar15;
    uVar15 = uVar15 ^ uVar39;
    uVar27 = uVar30 >> 0x36 | uVar30 << 10;
    uVar22 = ~uVar11 & uVar27 ^ uVar14;
    uVar34 = uVar34 ^ uVar29;
    uVar29 = uVar29 ^ uVar35;
    uVar30 = uVar34 >> 0x31 | uVar34 << 0xf;
    uVar10 = ~uVar27 & uVar30 ^ uVar11;
    uVar12 = uVar12 ^ uVar8;
    uVar2 = uVar12 >> 8 | uVar12 << 0x38;
    uVar33 = ~uVar14 & uVar11 ^ uVar2;
    uVar29 = uVar29 >> 2 | uVar29 << 0x3e;
    uVar27 = ~uVar30 & uVar2 ^ uVar27;
    uVar30 = ~uVar2 & uVar14 ^ uVar30;
    uVar32 = uVar32 ^ uVar20;
    uVar8 = uVar8 ^ uVar38;
    uVar14 = uVar15 >> 0x3e | uVar15 << 2;
    uVar2 = uVar32 >> 0x17 | uVar32 << 0x29;
    uVar38 = ~uVar14 & uVar29 ^ uVar2;
    uVar3 = uVar3 >> 0x19 | uVar3 << 0x27;
    uVar15 = uVar8 >> 9 | uVar8 << 0x37;
    uVar11 = uVar9 ^ uVar30 ^ uVar5 ^ uVar25 ^ uVar38;
    uVar8 = ~uVar15 & uVar3 ^ uVar29;
    uVar29 = ~uVar29 & uVar15 ^ uVar14;
    uVar20 = uVar7 ^ uVar22 ^ uVar21 ^ uVar6 ^ uVar8;
    uVar15 = ~uVar3 & uVar2 ^ uVar15;
    uVar18 = uVar1 ^ uVar33 ^ uVar17 ^ uVar19 ^ uVar29;
    uVar3 = ~uVar2 & uVar14 ^ uVar3;
    uVar39 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar11;
    uVar2 = uVar36 ^ uVar10 ^ uVar23 ^ uVar16 ^ uVar15;
    uVar34 = uVar31 ^ uVar27 ^ uVar40 ^ uVar24 ^ uVar3;
    uVar29 = uVar29 ^ uVar39;
    uVar12 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar2;
    uVar13 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar34;
    uVar29 = uVar29 >> 0x32 | uVar29 << 0xe;
    uVar18 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar18;
    uVar30 = uVar30 ^ uVar13;
    uVar21 = uVar21 ^ uVar18;
    uVar14 = uVar30 >> 0x2b | uVar30 << 0x15;
    uVar8 = uVar8 ^ uVar18;
    uVar20 = (uVar34 >> 0x3f | uVar34 << 1) ^ uVar20;
    uVar16 = uVar16 ^ uVar20;
    uVar2 = uVar16 >> 0x14 | uVar16 << 0x2c;
    uVar31 = uVar31 ^ uVar12;
    uVar11 = uVar31 >> 0x15 | uVar31 << 0x2b;
    uVar32 = ~uVar14 & uVar29 ^ uVar11;
    uVar34 = ~uVar11 & uVar14 ^ uVar2;
    uVar30 = uVar21 ^ 0x8000000000008003 ^ ~uVar2 & uVar11;
    uVar31 = ~uVar21 & uVar2 ^ uVar29;
    uVar14 = ~uVar29 & uVar21 ^ uVar14;
    uVar3 = uVar3 ^ uVar12;
    uVar5 = uVar5 ^ uVar13;
    uVar10 = uVar10 ^ uVar20;
    uVar2 = uVar3 >> 3 | uVar3 << 0x3d;
    uVar29 = uVar5 >> 0x24 | uVar5 << 0x1c;
    uVar19 = uVar19 ^ uVar39;
    uVar11 = uVar10 >> 0x13 | uVar10 << 0x2d;
    uVar10 = uVar19 >> 0x2c | uVar19 << 0x14;
    uVar35 = ~uVar2 & uVar29 ^ uVar11;
    uVar7 = uVar7 ^ uVar18;
    uVar19 = uVar7 >> 0x3d | uVar7 << 3;
    uVar16 = ~uVar11 & uVar2 ^ uVar19;
    uVar11 = ~uVar19 & uVar11 ^ uVar10;
    uVar7 = ~uVar10 & uVar19 ^ uVar29;
    uVar2 = ~uVar29 & uVar10 ^ uVar2;
    uVar10 = uVar8 >> 0x2e | uVar8 << 0x12;
    uVar23 = uVar23 ^ uVar20;
    uVar33 = uVar33 ^ uVar39;
    uVar38 = uVar38 ^ uVar13;
    uVar29 = uVar23 >> 0x3f | uVar23 << 1;
    uVar9 = uVar9 ^ uVar13;
    uVar8 = uVar33 >> 0x38 | uVar33 << 8;
    uVar23 = uVar9 >> 0x27 | uVar9 << 0x19;
    uVar5 = ~uVar10 & uVar29 ^ uVar8;
    uVar24 = uVar24 ^ uVar12;
    uVar19 = uVar24 >> 0x3a | uVar24 << 6;
    uVar3 = ~uVar8 & uVar10 ^ uVar23;
    uVar8 = ~uVar23 & uVar8 ^ uVar19;
    uVar24 = ~uVar19 & uVar23 ^ uVar29;
    uVar10 = ~uVar29 & uVar19 ^ uVar10;
    uVar17 = uVar17 ^ uVar39;
    uVar6 = uVar6 ^ uVar18;
    uVar39 = uVar39 ^ uVar1;
    uVar23 = uVar17 >> 0x25 | uVar17 << 0x1b;
    uVar1 = uVar6 >> 0x1c | uVar6 << 0x24;
    uVar36 = uVar36 ^ uVar20;
    uVar21 = uVar36 >> 0x36 | uVar36 << 10;
    uVar29 = ~uVar1 & uVar21 ^ uVar23;
    uVar27 = uVar27 ^ uVar12;
    uVar9 = uVar27 >> 0x31 | uVar27 << 0xf;
    uVar17 = ~uVar21 & uVar9 ^ uVar1;
    uVar19 = uVar38 >> 8 | uVar38 << 0x38;
    uVar21 = ~uVar9 & uVar19 ^ uVar21;
    uVar9 = ~uVar19 & uVar23 ^ uVar9;
    uVar19 = ~uVar23 & uVar1 ^ uVar19;
    uVar18 = uVar18 ^ uVar22;
    uVar13 = uVar13 ^ uVar25;
    uVar20 = uVar20 ^ uVar15;
    uVar12 = uVar12 ^ uVar40;
    uVar6 = uVar12 >> 2 | uVar12 << 0x3e;
    uVar22 = uVar13 >> 9 | uVar13 << 0x37;
    uVar23 = uVar39 >> 0x19 | uVar39 << 0x27;
    uVar18 = uVar18 >> 0x17 | uVar18 << 0x29;
    uVar1 = uVar20 >> 0x3e | uVar20 << 2;
    uVar25 = ~uVar1 & uVar6 ^ uVar18;
    uVar13 = ~uVar23 & uVar18 ^ uVar22;
    uVar40 = ~uVar18 & uVar1 ^ uVar23;
    uVar18 = uVar5 ^ uVar9 ^ uVar14 ^ uVar35 ^ uVar25;
    uVar20 = uVar8 ^ uVar17 ^ uVar34 ^ uVar11 ^ uVar13;
    uVar1 = ~uVar6 & uVar22 ^ uVar1;
    uVar15 = uVar3 ^ uVar21 ^ uVar32 ^ uVar16 ^ uVar40;
    uVar6 = ~uVar22 & uVar23 ^ uVar6;
    uVar23 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar20;
    uVar22 = uVar10 ^ uVar19 ^ uVar31 ^ uVar2 ^ uVar1;
    uVar12 = uVar24 ^ uVar29 ^ uVar30 ^ uVar7 ^ uVar6;
    uVar36 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar22;
    uVar38 = (uVar15 >> 0x3f | uVar15 << 1) ^ uVar12;
    uVar15 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar15;
    uVar18 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar18;
    uVar3 = uVar3 ^ uVar23;
    uVar6 = uVar6 ^ uVar36;
    uVar20 = uVar3 >> 0x15 | uVar3 << 0x2b;
    uVar1 = uVar1 ^ uVar18;
    uVar9 = uVar9 ^ uVar15;
    uVar19 = uVar19 ^ uVar18;
    uVar1 = uVar1 >> 0x32 | uVar1 << 0xe;
    uVar11 = uVar11 ^ uVar38;
    uVar30 = uVar30 ^ uVar36;
    uVar22 = uVar11 >> 0x14 | uVar11 << 0x2c;
    uVar33 = uVar30 ^ 0x8000000000008002 ^ ~uVar22 & uVar20;
    uVar11 = uVar9 >> 0x2b | uVar9 << 0x15;
    uVar12 = ~uVar1 & uVar30 ^ uVar11;
    uVar27 = ~uVar11 & uVar1 ^ uVar20;
    uVar3 = ~uVar20 & uVar11 ^ uVar22;
    uVar1 = ~uVar30 & uVar22 ^ uVar1;
    uVar17 = uVar17 ^ uVar38;
    uVar2 = uVar2 ^ uVar18;
    uVar24 = uVar24 ^ uVar36;
    uVar39 = uVar17 >> 0x13 | uVar17 << 0x2d;
    uVar14 = uVar14 ^ uVar15;
    uVar20 = uVar24 >> 0x3d | uVar24 << 3;
    uVar11 = uVar2 >> 0x2c | uVar2 << 0x14;
    uVar22 = uVar14 >> 0x24 | uVar14 << 0x1c;
    uVar2 = ~uVar20 & uVar39 ^ uVar11;
    uVar40 = uVar40 ^ uVar23;
    uVar17 = uVar40 >> 3 | uVar40 << 0x3d;
    uVar24 = ~uVar39 & uVar17 ^ uVar20;
    uVar39 = ~uVar17 & uVar22 ^ uVar39;
    uVar30 = uVar19 >> 0x38 | uVar19 << 8;
    uVar9 = ~uVar11 & uVar20 ^ uVar22;
    uVar17 = ~uVar22 & uVar11 ^ uVar17;
    uVar19 = uVar6 >> 0x2e | uVar6 << 0x12;
    uVar34 = uVar34 ^ uVar38;
    uVar22 = uVar34 >> 0x3f | uVar34 << 1;
    uVar5 = uVar5 ^ uVar15;
    uVar14 = uVar5 >> 0x27 | uVar5 << 0x19;
    uVar34 = ~uVar30 & uVar19 ^ uVar14;
    uVar25 = uVar25 ^ uVar15;
    uVar15 = uVar15 ^ uVar35;
    uVar16 = uVar16 ^ uVar23;
    uVar6 = ~uVar19 & uVar22 ^ uVar30;
    uVar11 = uVar16 >> 0x3a | uVar16 << 6;
    uVar5 = ~uVar11 & uVar14 ^ uVar22;
    uVar30 = ~uVar14 & uVar30 ^ uVar11;
    uVar19 = ~uVar22 & uVar11 ^ uVar19;
    uVar22 = uVar25 >> 8 | uVar25 << 0x38;
    uVar31 = uVar31 ^ uVar18;
    uVar18 = uVar18 ^ uVar10;
    uVar14 = uVar31 >> 0x25 | uVar31 << 0x1b;
    uVar8 = uVar8 ^ uVar38;
    uVar16 = uVar8 >> 0x36 | uVar8 << 10;
    uVar7 = uVar7 ^ uVar36;
    uVar38 = uVar38 ^ uVar13;
    uVar10 = uVar7 >> 0x1c | uVar7 << 0x24;
    uVar35 = ~uVar10 & uVar16 ^ uVar14;
    uVar21 = uVar21 ^ uVar23;
    uVar11 = uVar21 >> 0x31 | uVar21 << 0xf;
    uVar31 = ~uVar22 & uVar14 ^ uVar11;
    uVar7 = ~uVar16 & uVar11 ^ uVar10;
    uVar14 = ~uVar14 & uVar10 ^ uVar22;
    uVar16 = ~uVar11 & uVar22 ^ uVar16;
    uVar23 = uVar23 ^ uVar32;
    uVar36 = uVar36 ^ uVar29;
    uVar29 = uVar15 >> 9 | uVar15 << 0x37;
    uVar22 = uVar23 >> 2 | uVar23 << 0x3e;
    uVar20 = uVar38 >> 0x3e | uVar38 << 2;
    uVar10 = uVar36 >> 0x17 | uVar36 << 0x29;
    uVar13 = ~uVar20 & uVar22 ^ uVar10;
    uVar11 = uVar18 >> 0x19 | uVar18 << 0x27;
    uVar23 = uVar6 ^ uVar31 ^ uVar12 ^ uVar39 ^ uVar13;
    uVar36 = ~uVar11 & uVar10 ^ uVar29;
    uVar10 = ~uVar10 & uVar20 ^ uVar11;
    uVar11 = ~uVar29 & uVar11 ^ uVar22;
    uVar8 = uVar30 ^ uVar7 ^ uVar3 ^ uVar2 ^ uVar36;
    uVar21 = uVar34 ^ uVar16 ^ uVar27 ^ uVar24 ^ uVar10;
    uVar18 = uVar5 ^ uVar35 ^ uVar33 ^ uVar9 ^ uVar11;
    uVar20 = ~uVar22 & uVar29 ^ uVar20;
    uVar40 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar8;
    uVar29 = uVar19 ^ uVar14 ^ uVar1 ^ uVar17 ^ uVar20;
    uVar38 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar18;
    uVar8 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar29;
    uVar10 = uVar10 ^ uVar40;
    uVar23 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar23;
    uVar21 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar21;
    uVar10 = uVar10 >> 3 | uVar10 << 0x3d;
    uVar11 = uVar11 ^ uVar8;
    uVar2 = uVar2 ^ uVar38;
    uVar31 = uVar31 ^ uVar21;
    uVar20 = uVar20 ^ uVar23;
    uVar17 = uVar17 ^ uVar23;
    uVar11 = uVar11 >> 0x2e | uVar11 << 0x12;
    uVar33 = uVar33 ^ uVar8;
    uVar29 = uVar2 >> 0x14 | uVar2 << 0x2c;
    uVar18 = uVar31 >> 0x2b | uVar31 << 0x15;
    uVar22 = uVar20 >> 0x32 | uVar20 << 0xe;
    uVar34 = uVar34 ^ uVar40;
    uVar2 = uVar34 >> 0x15 | uVar34 << 0x2b;
    uVar15 = uVar33 ^ 0x8000000000000080 ^ ~uVar29 & uVar2;
    uVar25 = ~uVar18 & uVar22 ^ uVar2;
    uVar20 = ~uVar2 & uVar18 ^ uVar29;
    uVar29 = ~uVar33 & uVar29 ^ uVar22;
    uVar17 = uVar17 >> 0x2c | uVar17 << 0x14;
    uVar18 = ~uVar22 & uVar33 ^ uVar18;
    uVar13 = uVar13 ^ uVar21;
    uVar7 = uVar7 ^ uVar38;
    uVar12 = uVar12 ^ uVar21;
    uVar31 = uVar7 >> 0x13 | uVar7 << 0x2d;
    uVar22 = uVar12 >> 0x24 | uVar12 << 0x1c;
    uVar32 = ~uVar10 & uVar22 ^ uVar31;
    uVar5 = uVar5 ^ uVar8;
    uVar2 = uVar5 >> 0x3d | uVar5 << 3;
    uVar34 = ~uVar31 & uVar10 ^ uVar2;
    uVar31 = ~uVar2 & uVar31 ^ uVar17;
    uVar12 = ~uVar17 & uVar2 ^ uVar22;
    uVar10 = ~uVar22 & uVar17 ^ uVar10;
    uVar3 = uVar3 ^ uVar38;
    uVar14 = uVar14 ^ uVar23;
    uVar22 = uVar3 >> 0x3f | uVar3 << 1;
    uVar6 = uVar6 ^ uVar21;
    uVar3 = uVar14 >> 0x38 | uVar14 << 8;
    uVar21 = uVar21 ^ uVar39;
    uVar2 = uVar6 >> 0x27 | uVar6 << 0x19;
    uVar7 = ~uVar11 & uVar22 ^ uVar3;
    uVar14 = ~uVar3 & uVar11 ^ uVar2;
    uVar24 = uVar24 ^ uVar40;
    uVar17 = uVar24 >> 0x3a | uVar24 << 6;
    uVar5 = ~uVar2 & uVar3 ^ uVar17;
    uVar1 = uVar1 ^ uVar23;
    uVar24 = ~uVar17 & uVar2 ^ uVar22;
    uVar23 = uVar23 ^ uVar19;
    uVar11 = ~uVar22 & uVar17 ^ uVar11;
    uVar33 = uVar1 >> 0x25 | uVar1 << 0x1b;
    uVar9 = uVar9 ^ uVar8;
    uVar8 = uVar8 ^ uVar35;
    uVar1 = uVar9 >> 0x1c | uVar9 << 0x24;
    uVar16 = uVar16 ^ uVar40;
    uVar40 = uVar40 ^ uVar27;
    uVar3 = uVar16 >> 0x31 | uVar16 << 0xf;
    uVar30 = uVar30 ^ uVar38;
    uVar38 = uVar38 ^ uVar36;
    uVar16 = uVar30 >> 0x36 | uVar30 << 10;
    uVar22 = ~uVar1 & uVar16 ^ uVar33;
    uVar17 = ~uVar16 & uVar3 ^ uVar1;
    uVar2 = uVar38 >> 0x3e | uVar38 << 2;
    uVar19 = uVar13 >> 8 | uVar13 << 0x38;
    uVar16 = ~uVar3 & uVar19 ^ uVar16;
    uVar6 = ~uVar33 & uVar1 ^ uVar19;
    uVar3 = ~uVar19 & uVar33 ^ uVar3;
    uVar35 = uVar23 >> 0x19 | uVar23 << 0x27;
    uVar19 = uVar40 >> 2 | uVar40 << 0x3e;
    uVar23 = uVar21 >> 9 | uVar21 << 0x37;
    uVar9 = uVar8 >> 0x17 | uVar8 << 0x29;
    uVar33 = ~uVar2 & uVar19 ^ uVar9;
    uVar36 = ~uVar23 & uVar35 ^ uVar19;
    uVar1 = uVar7 ^ uVar3 ^ uVar18 ^ uVar32 ^ uVar33;
    uVar39 = ~uVar35 & uVar9 ^ uVar23;
    uVar8 = uVar24 ^ uVar22 ^ uVar15 ^ uVar12 ^ uVar36;
    uVar35 = ~uVar9 & uVar2 ^ uVar35;
    uVar2 = ~uVar19 & uVar23 ^ uVar2;
    uVar23 = uVar5 ^ uVar17 ^ uVar20 ^ uVar31 ^ uVar39;
    uVar30 = uVar14 ^ uVar16 ^ uVar25 ^ uVar34 ^ uVar35;
    uVar19 = uVar11 ^ uVar6 ^ uVar29 ^ uVar10 ^ uVar2;
    uVar40 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar1;
    uVar1 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar23;
    uVar8 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar8;
    uVar27 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar19;
    uVar30 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar30;
    uVar2 = uVar2 ^ uVar40;
    uVar35 = uVar35 ^ uVar1;
    uVar3 = uVar3 ^ uVar30;
    uVar2 = uVar2 >> 0x32 | uVar2 << 0xe;
    uVar36 = uVar36 ^ uVar27;
    uVar15 = uVar15 ^ uVar27;
    uVar9 = uVar3 >> 0x2b | uVar3 << 0x15;
    uVar31 = uVar31 ^ uVar8;
    uVar19 = uVar31 >> 0x14 | uVar31 << 0x2c;
    uVar14 = uVar14 ^ uVar1;
    uVar14 = uVar14 >> 0x15 | uVar14 << 0x2b;
    uVar21 = ~uVar9 & uVar2 ^ uVar14;
    uVar23 = ~uVar14 & uVar9 ^ uVar19;
    uVar13 = uVar15 ^ 0x800a ^ ~uVar19 & uVar14;
    uVar3 = uVar35 >> 3 | uVar35 << 0x3d;
    uVar19 = ~uVar15 & uVar19 ^ uVar2;
    uVar9 = ~uVar2 & uVar15 ^ uVar9;
    uVar18 = uVar18 ^ uVar30;
    uVar31 = uVar18 >> 0x24 | uVar18 << 0x1c;
    uVar17 = uVar17 ^ uVar8;
    uVar24 = uVar24 ^ uVar27;
    uVar14 = uVar17 >> 0x13 | uVar17 << 0x2d;
    uVar2 = uVar24 >> 0x3d | uVar24 << 3;
    uVar38 = ~uVar3 & uVar31 ^ uVar14;
    uVar18 = ~uVar14 & uVar3 ^ uVar2;
    uVar10 = uVar10 ^ uVar40;
    uVar17 = uVar10 >> 0x2c | uVar10 << 0x14;
    uVar14 = ~uVar2 & uVar14 ^ uVar17;
    uVar24 = ~uVar17 & uVar2 ^ uVar31;
    uVar3 = ~uVar31 & uVar17 ^ uVar3;
    uVar6 = uVar6 ^ uVar40;
    uVar10 = uVar36 >> 0x2e | uVar36 << 0x12;
    uVar15 = uVar6 >> 0x38 | uVar6 << 8;
    uVar20 = uVar20 ^ uVar8;
    uVar17 = uVar20 >> 0x3f | uVar20 << 1;
    uVar7 = uVar7 ^ uVar30;
    uVar31 = uVar7 >> 0x27 | uVar7 << 0x19;
    uVar34 = uVar34 ^ uVar1;
    uVar6 = ~uVar10 & uVar17 ^ uVar15;
    uVar2 = uVar34 >> 0x3a | uVar34 << 6;
    uVar20 = ~uVar31 & uVar15 ^ uVar2;
    uVar35 = ~uVar15 & uVar10 ^ uVar31;
    uVar7 = ~uVar2 & uVar31 ^ uVar17;
    uVar22 = uVar27 ^ uVar22;
    uVar10 = ~uVar17 & uVar2 ^ uVar10;
    uVar29 = uVar29 ^ uVar40;
    uVar40 = uVar40 ^ uVar11;
    uVar17 = uVar22 >> 0x17 | uVar22 << 0x29;
    uVar12 = uVar12 ^ uVar27;
    uVar22 = uVar29 >> 0x25 | uVar29 << 0x1b;
    uVar2 = uVar12 >> 0x1c | uVar12 << 0x24;
    uVar16 = uVar16 ^ uVar1;
    uVar5 = uVar5 ^ uVar8;
    uVar8 = uVar8 ^ uVar39;
    uVar31 = uVar5 >> 0x36 | uVar5 << 10;
    uVar27 = ~uVar2 & uVar31 ^ uVar22;
    uVar34 = uVar16 >> 0x31 | uVar16 << 0xf;
    uVar5 = ~uVar31 & uVar34 ^ uVar2;
    uVar33 = uVar33 ^ uVar30;
    uVar30 = uVar30 ^ uVar32;
    uVar29 = uVar33 >> 8 | uVar33 << 0x38;
    uVar33 = ~uVar22 & uVar2 ^ uVar29;
    uVar31 = ~uVar34 & uVar29 ^ uVar31;
    uVar34 = ~uVar29 & uVar22 ^ uVar34;
    uVar1 = uVar1 ^ uVar25;
    uVar22 = uVar1 >> 2 | uVar1 << 0x3e;
    uVar29 = uVar30 >> 9 | uVar30 << 0x37;
    uVar15 = uVar40 >> 0x19 | uVar40 << 0x27;
    uVar1 = uVar8 >> 0x3e | uVar8 << 2;
    uVar12 = ~uVar1 & uVar22 ^ uVar17;
    uVar36 = ~uVar15 & uVar17 ^ uVar29;
    uVar11 = ~uVar17 & uVar1 ^ uVar15;
    uVar16 = uVar6 ^ uVar34 ^ uVar9 ^ uVar38 ^ uVar12;
    uVar2 = uVar20 ^ uVar5 ^ uVar23 ^ uVar14 ^ uVar36;
    uVar40 = ~uVar29 & uVar15 ^ uVar22;
    uVar15 = uVar35 ^ uVar31 ^ uVar21 ^ uVar18 ^ uVar11;
    uVar1 = ~uVar22 & uVar29 ^ uVar1;
    uVar29 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar2;
    uVar17 = uVar7 ^ uVar27 ^ uVar13 ^ uVar24 ^ uVar40;
    uVar22 = uVar10 ^ uVar33 ^ uVar19 ^ uVar3 ^ uVar1;
    uVar37 = (uVar15 >> 0x3f | uVar15 << 1) ^ uVar17;
    uVar35 = uVar35 ^ uVar29;
    uVar11 = uVar11 ^ uVar29;
    uVar39 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar22;
    uVar16 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar16;
    uVar15 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar15;
    uVar13 = uVar13 ^ uVar39;
    uVar1 = uVar1 ^ uVar16;
    uVar40 = uVar40 ^ uVar39;
    uVar34 = uVar34 ^ uVar15;
    uVar17 = uVar1 >> 0x32 | uVar1 << 0xe;
    uVar14 = uVar14 ^ uVar37;
    uVar22 = uVar14 >> 0x14 | uVar14 << 0x2c;
    uVar1 = uVar35 >> 0x15 | uVar35 << 0x2b;
    uVar25 = uVar13 ^ 0x800000008000000a ^ ~uVar22 & uVar1;
    uVar2 = uVar34 >> 0x2b | uVar34 << 0x15;
    uVar30 = ~uVar2 & uVar17 ^ uVar1;
    uVar14 = ~uVar17 & uVar13 ^ uVar2;
    uVar34 = ~uVar1 & uVar2 ^ uVar22;
    uVar1 = uVar11 >> 3 | uVar11 << 0x3d;
    uVar17 = ~uVar13 & uVar22 ^ uVar17;
    uVar9 = uVar9 ^ uVar15;
    uVar22 = uVar9 >> 0x24 | uVar9 << 0x1c;
    uVar5 = uVar5 ^ uVar37;
    uVar3 = uVar3 ^ uVar16;
    uVar9 = uVar5 >> 0x13 | uVar5 << 0x2d;
    uVar2 = uVar3 >> 0x2c | uVar3 << 0x14;
    uVar32 = ~uVar1 & uVar22 ^ uVar9;
    uVar7 = uVar7 ^ uVar39;
    uVar11 = uVar7 >> 0x3d | uVar7 << 3;
    uVar5 = ~uVar9 & uVar1 ^ uVar11;
    uVar9 = ~uVar11 & uVar9 ^ uVar2;
    uVar8 = ~uVar2 & uVar11 ^ uVar22;
    uVar1 = ~uVar22 & uVar2 ^ uVar1;
    uVar2 = uVar40 >> 0x2e | uVar40 << 0x12;
    uVar23 = uVar23 ^ uVar37;
    uVar33 = uVar33 ^ uVar16;
    uVar22 = uVar23 >> 0x3f | uVar23 << 1;
    uVar6 = uVar6 ^ uVar15;
    uVar23 = uVar33 >> 0x38 | uVar33 << 8;
    uVar3 = uVar6 >> 0x27 | uVar6 << 0x19;
    uVar33 = ~uVar2 & uVar22 ^ uVar23;
    uVar6 = ~uVar23 & uVar2 ^ uVar3;
    uVar18 = uVar18 ^ uVar29;
    uVar11 = uVar18 >> 0x3a | uVar18 << 6;
    uVar35 = ~uVar3 & uVar23 ^ uVar11;
    uVar13 = ~uVar11 & uVar3 ^ uVar22;
    uVar2 = ~uVar22 & uVar11 ^ uVar2;
    uVar19 = uVar19 ^ uVar16;
    uVar16 = uVar16 ^ uVar10;
    uVar3 = uVar19 >> 0x25 | uVar19 << 0x1b;
    uVar31 = uVar31 ^ uVar29;
    uVar19 = uVar31 >> 0x31 | uVar31 << 0xf;
    uVar24 = uVar24 ^ uVar39;
    uVar39 = uVar39 ^ uVar27;
    uVar22 = uVar24 >> 0x1c | uVar24 << 0x24;
    uVar20 = uVar20 ^ uVar37;
    uVar37 = uVar37 ^ uVar36;
    uVar10 = uVar20 >> 0x36 | uVar20 << 10;
    uVar31 = ~uVar22 & uVar10 ^ uVar3;
    uVar24 = ~uVar10 & uVar19 ^ uVar22;
    uVar12 = uVar12 ^ uVar15;
    uVar15 = uVar15 ^ uVar38;
    uVar20 = uVar12 >> 8 | uVar12 << 0x38;
    uVar12 = ~uVar3 & uVar22 ^ uVar20;
    uVar10 = ~uVar19 & uVar20 ^ uVar10;
    uVar11 = uVar15 >> 9 | uVar15 << 0x37;
    uVar16 = uVar16 >> 0x19 | uVar16 << 0x27;
    uVar23 = uVar39 >> 0x17 | uVar39 << 0x29;
    uVar38 = ~uVar16 & uVar23 ^ uVar11;
    uVar22 = uVar35 ^ uVar24 ^ uVar34 ^ uVar9 ^ uVar38;
    uVar18 = uVar37 >> 0x3e | uVar37 << 2;
    uVar19 = ~uVar20 & uVar3 ^ uVar19;
    uVar29 = uVar29 ^ uVar21;
    uVar29 = uVar29 >> 2 | uVar29 << 0x3e;
    uVar20 = ~uVar18 & uVar29 ^ uVar23;
    uVar3 = ~uVar23 & uVar18 ^ uVar16;
    uVar7 = uVar33 ^ uVar19 ^ uVar14 ^ uVar32 ^ uVar20;
    uVar16 = ~uVar11 & uVar16 ^ uVar29;
    uVar18 = ~uVar29 & uVar11 ^ uVar18;
    uVar21 = uVar6 ^ uVar10 ^ uVar30 ^ uVar5 ^ uVar3;
    uVar40 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar22;
    uVar11 = uVar2 ^ uVar12 ^ uVar17 ^ uVar1 ^ uVar18;
    uVar23 = uVar13 ^ uVar31 ^ uVar25 ^ uVar8 ^ uVar16;
    uVar29 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar11;
    uVar36 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar23;
    uVar3 = uVar3 ^ uVar40;
    uVar7 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar7;
    uVar21 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar21;
    uVar24 = uVar24 ^ uVar36;
    uVar23 = uVar3 >> 3 | uVar3 << 0x3d;
    uVar19 = uVar19 ^ uVar21;
    uVar18 = uVar18 ^ uVar7;
    uVar25 = uVar25 ^ uVar29;
    uVar6 = uVar6 ^ uVar40;
    uVar3 = uVar19 >> 0x2b | uVar19 << 0x15;
    uVar15 = uVar18 >> 0x32 | uVar18 << 0xe;
    uVar18 = uVar6 >> 0x15 | uVar6 << 0x2b;
    uVar22 = ~uVar3 & uVar15 ^ uVar18;
    uVar9 = uVar9 ^ uVar36;
    uVar19 = uVar9 >> 0x14 | uVar9 << 0x2c;
    uVar11 = ~uVar18 & uVar3 ^ uVar19;
    uVar27 = uVar25 ^ 0x8000000080008081 ^ ~uVar19 & uVar18;
    uVar3 = ~uVar15 & uVar25 ^ uVar3;
    uVar15 = ~uVar25 & uVar19 ^ uVar15;
    uVar9 = uVar24 >> 0x13 | uVar24 << 0x2d;
    uVar16 = uVar16 ^ uVar29;
    uVar14 = uVar14 ^ uVar21;
    uVar18 = uVar16 >> 0x2e | uVar16 << 0x12;
    uVar19 = uVar14 >> 0x24 | uVar14 << 0x1c;
    uVar1 = uVar1 ^ uVar7;
    uVar13 = uVar13 ^ uVar29;
    uVar6 = uVar13 >> 0x3d | uVar13 << 3;
    uVar14 = uVar1 >> 0x2c | uVar1 << 0x14;
    uVar39 = ~uVar23 & uVar19 ^ uVar9;
    uVar24 = ~uVar9 & uVar23 ^ uVar6;
    uVar16 = ~uVar14 & uVar6 ^ uVar19;
    uVar1 = ~uVar6 & uVar9 ^ uVar14;
    uVar23 = ~uVar19 & uVar14 ^ uVar23;
    uVar34 = uVar34 ^ uVar36;
    uVar12 = uVar12 ^ uVar7;
    uVar19 = uVar34 >> 0x3f | uVar34 << 1;
    uVar33 = uVar33 ^ uVar21;
    uVar5 = uVar5 ^ uVar40;
    uVar9 = uVar12 >> 0x38 | uVar12 << 8;
    uVar34 = uVar33 >> 0x27 | uVar33 << 0x19;
    uVar13 = ~uVar18 & uVar19 ^ uVar9;
    uVar14 = uVar5 >> 0x3a | uVar5 << 6;
    uVar33 = ~uVar34 & uVar9 ^ uVar14;
    uVar12 = ~uVar9 & uVar18 ^ uVar34;
    uVar6 = ~uVar14 & uVar34 ^ uVar19;
    uVar18 = ~uVar19 & uVar14 ^ uVar18;
    uVar8 = uVar8 ^ uVar29;
    uVar35 = uVar35 ^ uVar36;
    uVar9 = uVar8 >> 0x1c | uVar8 << 0x24;
    uVar36 = uVar36 ^ uVar38;
    uVar34 = uVar35 >> 0x36 | uVar35 << 10;
    uVar10 = uVar10 ^ uVar40;
    uVar40 = uVar40 ^ uVar30;
    uVar17 = uVar17 ^ uVar7;
    uVar7 = uVar7 ^ uVar2;
    uVar2 = uVar17 >> 0x25 | uVar17 << 0x1b;
    uVar17 = ~uVar9 & uVar34 ^ uVar2;
    uVar10 = uVar10 >> 0x31 | uVar10 << 0xf;
    uVar38 = uVar40 >> 2 | uVar40 << 0x3e;
    uVar14 = ~uVar34 & uVar10 ^ uVar9;
    uVar20 = uVar20 ^ uVar21;
    uVar21 = uVar21 ^ uVar32;
    uVar19 = uVar20 >> 8 | uVar20 << 0x38;
    uVar34 = ~uVar10 & uVar19 ^ uVar34;
    uVar8 = ~uVar2 & uVar9 ^ uVar19;
    uVar10 = ~uVar19 & uVar2 ^ uVar10;
    uVar29 = uVar29 ^ uVar31;
    uVar2 = uVar29 >> 0x17 | uVar29 << 0x29;
    uVar29 = uVar21 >> 9 | uVar21 << 0x37;
    uVar20 = uVar7 >> 0x19 | uVar7 << 0x27;
    uVar19 = uVar36 >> 0x3e | uVar36 << 2;
    uVar31 = ~uVar19 & uVar38 ^ uVar2;
    uVar25 = ~uVar2 & uVar19 ^ uVar20;
    uVar2 = ~uVar20 & uVar2 ^ uVar29;
    uVar19 = ~uVar38 & uVar29 ^ uVar19;
    uVar5 = uVar13 ^ uVar10 ^ uVar3 ^ uVar39 ^ uVar31;
    uVar9 = uVar33 ^ uVar14 ^ uVar11 ^ uVar1 ^ uVar2;
    uVar21 = uVar12 ^ uVar34 ^ uVar22 ^ uVar24 ^ uVar25;
    uVar38 = ~uVar29 & uVar20 ^ uVar38;
    uVar20 = uVar18 ^ uVar8 ^ uVar15 ^ uVar23 ^ uVar19;
    uVar29 = uVar6 ^ uVar17 ^ uVar27 ^ uVar16 ^ uVar38;
    uVar7 = (uVar5 >> 0x3f | uVar5 << 1) ^ uVar9;
    uVar32 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar29;
    uVar21 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar21;
    uVar12 = uVar12 ^ uVar7;
    uVar20 = (uVar9 >> 0x3f | uVar9 << 1) ^ uVar20;
    uVar5 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar5;
    uVar12 = uVar12 >> 0x15 | uVar12 << 0x2b;
    uVar10 = uVar10 ^ uVar21;
    uVar25 = uVar25 ^ uVar7;
    uVar27 = uVar27 ^ uVar20;
    uVar19 = uVar19 ^ uVar5;
    uVar9 = uVar10 >> 0x2b | uVar10 << 0x15;
    uVar38 = uVar38 ^ uVar20;
    uVar29 = uVar19 >> 0x32 | uVar19 << 0xe;
    uVar1 = uVar1 ^ uVar32;
    uVar10 = uVar1 >> 0x14 | uVar1 << 0x2c;
    uVar30 = uVar27 ^ 0x8000000000008080 ^ ~uVar10 & uVar12;
    uVar36 = ~uVar9 & uVar29 ^ uVar12;
    uVar12 = ~uVar12 & uVar9 ^ uVar10;
    uVar9 = ~uVar29 & uVar27 ^ uVar9;
    uVar19 = uVar25 >> 3 | uVar25 << 0x3d;
    uVar29 = ~uVar27 & uVar10 ^ uVar29;
    uVar14 = uVar14 ^ uVar32;
    uVar6 = uVar6 ^ uVar20;
    uVar25 = uVar14 >> 0x13 | uVar14 << 0x2d;
    uVar3 = uVar3 ^ uVar21;
    uVar14 = uVar6 >> 0x3d | uVar6 << 3;
    uVar10 = uVar3 >> 0x24 | uVar3 << 0x1c;
    uVar6 = ~uVar25 & uVar19 ^ uVar14;
    uVar27 = ~uVar19 & uVar10 ^ uVar25;
    uVar23 = uVar23 ^ uVar5;
    uVar1 = uVar23 >> 0x2c | uVar23 << 0x14;
    uVar35 = ~uVar14 & uVar25 ^ uVar1;
    uVar8 = uVar8 ^ uVar5;
    uVar23 = ~uVar1 & uVar14 ^ uVar10;
    uVar14 = uVar8 >> 0x38 | uVar8 << 8;
    uVar19 = ~uVar10 & uVar1 ^ uVar19;
    uVar1 = uVar38 >> 0x2e | uVar38 << 0x12;
    uVar24 = uVar24 ^ uVar7;
    uVar13 = uVar13 ^ uVar21;
    uVar3 = uVar24 >> 0x3a | uVar24 << 6;
    uVar11 = uVar11 ^ uVar32;
    uVar24 = uVar13 >> 0x27 | uVar13 << 0x19;
    uVar10 = uVar11 >> 0x3f | uVar11 << 1;
    uVar13 = ~uVar14 & uVar1 ^ uVar24;
    uVar8 = ~uVar24 & uVar14 ^ uVar3;
    uVar14 = ~uVar1 & uVar10 ^ uVar14;
    uVar25 = ~uVar3 & uVar24 ^ uVar10;
    uVar1 = ~uVar10 & uVar3 ^ uVar1;
    uVar15 = uVar15 ^ uVar5;
    uVar16 = uVar16 ^ uVar20;
    uVar5 = uVar5 ^ uVar18;
    uVar15 = uVar15 >> 0x25 | uVar15 << 0x1b;
    uVar24 = uVar16 >> 0x1c | uVar16 << 0x24;
    uVar33 = uVar33 ^ uVar32;
    uVar34 = uVar34 ^ uVar7;
    uVar32 = uVar32 ^ uVar2;
    uVar38 = uVar33 >> 0x36 | uVar33 << 10;
    uVar10 = ~uVar24 & uVar38 ^ uVar15;
    uVar2 = uVar34 >> 0x31 | uVar34 << 0xf;
    uVar11 = ~uVar38 & uVar2 ^ uVar24;
    uVar31 = uVar31 ^ uVar21;
    uVar18 = uVar31 >> 8 | uVar31 << 0x38;
    uVar38 = ~uVar2 & uVar18 ^ uVar38;
    uVar2 = ~uVar18 & uVar15 ^ uVar2;
    uVar16 = uVar5 >> 0x19 | uVar5 << 0x27;
    uVar3 = uVar32 >> 0x3e | uVar32 << 2;
    uVar18 = ~uVar15 & uVar24 ^ uVar18;
    uVar7 = uVar7 ^ uVar22;
    uVar20 = uVar20 ^ uVar17;
    uVar21 = uVar21 ^ uVar39;
    uVar22 = uVar7 >> 2 | uVar7 << 0x3e;
    uVar17 = uVar20 >> 0x17 | uVar20 << 0x29;
    uVar20 = uVar21 >> 9 | uVar21 << 0x37;
    uVar34 = ~uVar3 & uVar22 ^ uVar17;
    uVar39 = ~uVar16 & uVar17 ^ uVar20;
    uVar5 = ~uVar17 & uVar3 ^ uVar16;
    uVar16 = ~uVar20 & uVar16 ^ uVar22;
    uVar32 = uVar14 ^ uVar2 ^ uVar9 ^ uVar27 ^ uVar34;
    uVar31 = uVar8 ^ uVar11 ^ uVar12 ^ uVar35 ^ uVar39;
    uVar17 = uVar13 ^ uVar38 ^ uVar36 ^ uVar6 ^ uVar5;
    uVar3 = ~uVar22 & uVar20 ^ uVar3;
    uVar20 = uVar25 ^ uVar10 ^ uVar30 ^ uVar23 ^ uVar16;
    uVar7 = (uVar32 >> 0x3f | uVar32 << 1) ^ uVar31;
    uVar22 = uVar1 ^ uVar18 ^ uVar29 ^ uVar19 ^ uVar3;
    uVar24 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar20;
    uVar15 = (uVar31 >> 0x3f | uVar31 << 1) ^ uVar22;
    uVar32 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar32;
    uVar17 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar17;
    uVar3 = uVar3 ^ uVar32;
    uVar2 = uVar2 ^ uVar17;
    uVar20 = uVar3 >> 0x32 | uVar3 << 0xe;
    uVar35 = uVar35 ^ uVar24;
    uVar30 = uVar30 ^ uVar15;
    uVar31 = uVar35 >> 0x14 | uVar35 << 0x2c;
    uVar13 = uVar13 ^ uVar7;
    uVar22 = uVar2 >> 0x2b | uVar2 << 0x15;
    uVar5 = uVar5 ^ uVar7;
    uVar16 = uVar16 ^ uVar15;
    uVar2 = uVar13 >> 0x15 | uVar13 << 0x2b;
    uVar3 = uVar16 >> 0x2e | uVar16 << 0x12;
    uVar13 = uVar30 ^ 0x80000001 ^ ~uVar31 & uVar2;
    uVar35 = ~uVar22 & uVar20 ^ uVar2;
    uVar16 = ~uVar2 & uVar22 ^ uVar31;
    auVar41 = vpblendd_avx2(ZEXT832(uVar13),auVar43,0xfc);
    uVar31 = ~uVar30 & uVar31 ^ uVar20;
    uVar22 = ~uVar20 & uVar30 ^ uVar22;
    uVar11 = uVar11 ^ uVar24;
    uVar9 = uVar9 ^ uVar17;
    uVar20 = uVar11 >> 0x13 | uVar11 << 0x2d;
    uVar11 = uVar5 >> 3 | uVar5 << 0x3d;
    uVar19 = uVar19 ^ uVar32;
    uVar25 = uVar25 ^ uVar15;
    uVar2 = uVar9 >> 0x24 | uVar9 << 0x1c;
    uVar19 = uVar19 >> 0x2c | uVar19 << 0x14;
    uVar5 = uVar25 >> 0x3d | uVar25 << 3;
    uVar25 = ~uVar11 & uVar2 ^ uVar20;
    uVar9 = ~uVar20 & uVar11 ^ uVar5;
    uVar20 = ~uVar5 & uVar20 ^ uVar19;
    uVar5 = ~uVar19 & uVar5 ^ uVar2;
    uVar11 = ~uVar2 & uVar19 ^ uVar11;
    uVar6 = uVar6 ^ uVar7;
    uVar18 = uVar18 ^ uVar32;
    uVar30 = uVar18 >> 0x38 | uVar18 << 8;
    uVar18 = uVar6 >> 0x3a | uVar6 << 6;
    uVar12 = uVar12 ^ uVar24;
    uVar2 = uVar12 >> 0x3f | uVar12 << 1;
    uVar14 = uVar14 ^ uVar17;
    uVar21 = ~uVar3 & uVar2 ^ uVar30;
    uVar14 = uVar14 >> 0x27 | uVar14 << 0x19;
    uVar19 = ~uVar30 & uVar3 ^ uVar14;
    uVar33 = ~uVar18 & uVar14 ^ uVar2;
    uVar30 = ~uVar14 & uVar30 ^ uVar18;
    uVar3 = ~uVar2 & uVar18 ^ uVar3;
    uVar29 = uVar29 ^ uVar32;
    uVar2 = uVar29 >> 0x25 | uVar29 << 0x1b;
    uVar23 = uVar23 ^ uVar15;
    uVar29 = uVar23 >> 0x1c | uVar23 << 0x24;
    uVar8 = uVar8 ^ uVar24;
    uVar18 = uVar8 >> 0x36 | uVar8 << 10;
    uVar6 = ~uVar29 & uVar18 ^ uVar2;
    uVar38 = uVar38 ^ uVar7;
    uVar23 = uVar38 >> 0x31 | uVar38 << 0xf;
    uVar12 = ~uVar18 & uVar23 ^ uVar29;
    uVar34 = uVar34 ^ uVar17;
    uVar14 = uVar34 >> 8 | uVar34 << 0x38;
    uVar38 = ~uVar2 & uVar29 ^ uVar14;
    uVar18 = ~uVar23 & uVar14 ^ uVar18;
    uVar17 = uVar17 ^ uVar27;
    uVar23 = ~uVar14 & uVar2 ^ uVar23;
    uVar15 = uVar15 ^ uVar10;
    uVar24 = uVar24 ^ uVar39;
    uVar14 = uVar17 >> 9 | uVar17 << 0x37;
    uVar34 = uVar15 >> 0x17 | uVar15 << 0x29;
    uVar2 = uVar24 >> 0x3e | uVar24 << 2;
    uVar7 = uVar7 ^ uVar36;
    uVar32 = uVar32 ^ uVar1;
    uVar29 = uVar7 >> 2 | uVar7 << 0x3e;
    uVar17 = uVar32 >> 0x19 | uVar32 << 0x27;
    uVar27 = ~uVar2 & uVar29 ^ uVar34;
    uVar10 = ~uVar17 & uVar34 ^ uVar14;
    uVar15 = ~uVar34 & uVar2 ^ uVar17;
    uVar1 = uVar30 ^ uVar12 ^ uVar16 ^ uVar20 ^ uVar10;
    uVar24 = uVar21 ^ uVar23 ^ uVar22 ^ uVar25 ^ uVar27;
    uVar7 = ~uVar14 & uVar17 ^ uVar29;
    uVar17 = uVar19 ^ uVar18 ^ uVar35 ^ uVar9 ^ uVar15;
    uVar2 = ~uVar29 & uVar14 ^ uVar2;
    uVar14 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar1;
    uVar8 = uVar33 ^ uVar6 ^ uVar13 ^ uVar5 ^ uVar7;
    uVar29 = uVar3 ^ uVar38 ^ uVar31 ^ uVar11 ^ uVar2;
    uVar34 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar8;
    uVar1 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar29;
    uVar24 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar24;
    uVar15 = uVar15 ^ uVar14;
    uVar17 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar17;
    uVar2 = uVar2 ^ uVar24;
    local_e0 = uVar15 >> 3 | uVar15 << 0x3d;
    uVar38 = uVar38 ^ uVar24;
    uVar23 = uVar23 ^ uVar17;
    local_100 = uVar2 >> 0x32 | uVar2 << 0xe;
    uVar27 = uVar27 ^ uVar17;
    uVar12 = uVar12 ^ uVar34;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar23 >> 0x2b | uVar23 << 0x15;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_100;
    auVar48 = vpunpcklqdq_avx(auVar45,auVar48);
    uVar19 = uVar19 ^ uVar14;
    uVar2 = uVar12 >> 0x13 | uVar12 << 0x2d;
    uVar20 = uVar20 ^ uVar34;
    uVar19 = uVar19 >> 0x15 | uVar19 << 0x2b;
    uVar7 = uVar7 ^ uVar1;
    uVar29 = uVar20 >> 0x14 | uVar20 << 0x2c;
    uVar23 = uVar7 >> 0x2e | uVar7 << 0x12;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar19;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar1;
    auVar49 = vpunpcklqdq_avx(auVar49,auVar47);
    auVar45 = vpunpcklqdq_avx(auVar47,auVar45);
    auVar42._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar49;
    auVar42._16_16_ = ZEXT116(1) * auVar48;
    auVar48 = vpinsrq_avx(auVar44,uVar29,1);
    auVar41 = auVar42 ^ auVar41;
    auVar46._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar48;
    auVar46._16_16_ = ZEXT116(1) * auVar45;
    auVar42 = valignq_avx512vl(auVar41,auVar42,1);
    local_100 = ~auVar41._0_8_ & uVar29 ^ local_100;
    auVar42 = vpand_avx2(auVar41,auVar42);
    auVar42 = vpblendd_avx2(auVar42,auVar41 ^ ZEXT832(~uVar29 & uVar19),3);
    uVar33 = uVar33 ^ uVar1;
    auVar42 = auVar42 ^ auVar46;
    uVar11 = uVar11 ^ uVar24;
    uVar20 = uVar33 >> 0x3d | uVar33 << 3;
    uVar22 = uVar22 ^ uVar17;
    uVar19 = uVar11 >> 0x2c | uVar11 << 0x14;
    uVar29 = uVar22 >> 0x24 | uVar22 << 0x1c;
    local_e8 = ~uVar20 & uVar2 ^ uVar19;
    uVar11 = uVar38 >> 0x38 | uVar38 << 8;
    local_f0 = ~local_e0 & uVar29 ^ uVar2;
    local_d8 = ~uVar2 & local_e0 ^ uVar20;
    local_148 = ~uVar19 & uVar20 ^ uVar29;
    local_e0 = ~uVar29 & uVar19 ^ local_e0;
    uVar9 = uVar9 ^ uVar14;
    uVar21 = uVar21 ^ uVar17;
    uVar19 = uVar9 >> 0x3a | uVar9 << 6;
    uVar17 = uVar17 ^ uVar25;
    uVar16 = uVar16 ^ uVar34;
    uVar2 = uVar21 >> 0x27 | uVar21 << 0x19;
    local_150 = uVar16 >> 0x3f | uVar16 << 1;
    local_138 = ~uVar23 & local_150 ^ uVar11;
    uVar30 = uVar30 ^ uVar34;
    uVar22 = ~local_150 & uVar19 ^ uVar23;
    local_110 = uVar17 >> 9 | uVar17 << 0x37;
    local_160 = ~uVar11 & uVar23 ^ uVar2;
    uVar29 = ~uVar2 & uVar11 ^ uVar19;
    local_150 = ~uVar19 & uVar2 ^ local_150;
    uVar11 = uVar27 >> 8 | uVar27 << 0x38;
    uVar19 = uVar30 >> 0x36 | uVar30 << 10;
    uVar5 = uVar5 ^ uVar1;
    uVar31 = uVar31 ^ uVar24;
    local_120 = uVar5 >> 0x1c | uVar5 << 0x24;
    uVar24 = uVar24 ^ uVar3;
    uVar18 = uVar18 ^ uVar14;
    uVar2 = uVar31 >> 0x25 | uVar31 << 0x1b;
    uVar18 = uVar18 >> 0x31 | uVar18 << 0xf;
    uVar17 = ~local_120 & uVar19 ^ uVar2;
    local_158 = ~uVar2 & local_120 ^ uVar11;
    local_f8 = ~uVar11 & uVar2 ^ uVar18;
    local_120 = ~uVar19 & uVar18 ^ local_120;
    uVar14 = uVar14 ^ uVar35;
    uVar19 = ~uVar18 & uVar11 ^ uVar19;
    uVar1 = uVar1 ^ uVar6;
    uVar34 = uVar34 ^ uVar10;
    local_108 = uVar24 >> 0x19 | uVar24 << 0x27;
    uVar2 = uVar14 >> 2 | uVar14 << 0x3e;
    uVar1 = uVar1 >> 0x17 | uVar1 << 0x29;
    uVar11 = uVar34 >> 0x3e | uVar34 << 2;
    uVar10 = ~local_110 & local_108 ^ uVar2;
    local_130 = ~uVar2 & local_110 ^ uVar11;
    local_110 = ~local_108 & uVar1 ^ local_110;
    local_128 = ~uVar11 & uVar2 ^ uVar1;
    local_108 = ~uVar1 & uVar11 ^ local_108;
    data = *(undefined1 (*) [32])data + (ulong)laneCount * 8;
  }
  *(undefined1 (*) [32])state = auVar42;
  *(ulong *)((long)state + 0x20) = local_100;
  *(ulong *)((long)state + 0x28) = local_148;
  *(ulong *)((long)state + 0x30) = local_e8;
  *(ulong *)((long)state + 0x38) = local_d8;
  *(ulong *)((long)state + 0x40) = local_f0;
  *(ulong *)((long)state + 0x48) = local_e0;
  *(ulong *)((long)state + 0x50) = local_150;
  *(ulong *)((long)state + 0x58) = uVar29;
  *(ulong *)((long)state + 0x60) = local_160;
  *(ulong *)((long)state + 0x68) = local_138;
  *(ulong *)((long)state + 0x70) = uVar22;
  *(ulong *)((long)state + 0x78) = uVar17;
  *(ulong *)((long)state + 0x80) = local_120;
  *(ulong *)((long)state + 0x88) = uVar19;
  *(ulong *)((long)state + 0x90) = local_f8;
  *(ulong *)((long)state + 0x98) = local_158;
  *(ulong *)((long)state + 0xa0) = uVar10;
  *(ulong *)((long)state + 0xa8) = local_110;
  *(ulong *)((long)state + 0xb0) = local_108;
  *(ulong *)((long)state + 0xb8) = local_128;
  *(ulong *)((long)state + 0xc0) = local_130;
  return -lVar4;
}

Assistant:

size_t KeccakF1600_FastLoop_Absorb(void *state, unsigned int laneCount, const unsigned char *data, size_t dataByteLen)
{
    size_t originalDataByteLen = dataByteLen;
    declareABCDE
    #ifndef KeccakP1600_fullUnrolling
    unsigned int i;
    #endif
    uint64_t *stateAsLanes = (uint64_t*)state;
    uint64_t *inDataAsLanes = (uint64_t*)data;

    copyFromState(A, stateAsLanes)
    while(dataByteLen >= laneCount*8) {
        addInput(A, inDataAsLanes, laneCount)
        rounds24
        inDataAsLanes += laneCount;
        dataByteLen -= laneCount*8;
    }
    copyToState(stateAsLanes, A)
    return originalDataByteLen - dataByteLen;
}